

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int cppwinrt::run(int argc,char **argv)

{
  _Base_ptr *members;
  _Rb_tree_node_base *p_Var1;
  size_t *psVar2;
  uint32_t uVar3;
  _Rb_tree_color _Var4;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__source;
  _Base_ptr p_Var6;
  method_signature *pmVar7;
  pointer ppVar8;
  string_view sVar9;
  size_type sVar10;
  undefined4 uVar11;
  pointer ppVar12;
  const_iterator cVar13;
  pointer pTVar14;
  bool bVar15;
  __type_conflict1 _Var16;
  TypeAttributes TVar18;
  uint32_t uVar19;
  _Rb_tree_color _Var20;
  long lVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar22;
  istream *piVar23;
  path *ppVar24;
  reference pvVar25;
  mapped_type *this;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var26;
  _Base_ptr p_Var27;
  pointer p_Var28;
  _Result<void> *p_Var29;
  undefined8 *puVar30;
  bool bVar17;
  size_t sVar31;
  method_signature *pmVar32;
  long lVar33;
  undefined8 uVar34;
  int iVar35;
  writer *type_00;
  UI_STRING *in_RDX;
  UI_STRING *uis;
  undefined8 extraout_RDX;
  UI_STRING *uis_00;
  UI_STRING *extraout_RDX_00;
  UI_STRING *uis_01;
  UI_STRING *uis_02;
  UI_STRING *uis_03;
  UI_STRING *extraout_RDX_01;
  TypeDef *extraout_RDX_02;
  TypeDef *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  UI_STRING *uis_04;
  UI_STRING *uis_05;
  TypeDef *type_01;
  UI_STRING *uis_06;
  UI_STRING *extraout_RDX_05;
  UI_STRING *extraout_RDX_06;
  UI_STRING *extraout_RDX_07;
  TypeDef *pTVar36;
  TypeDef *type_02;
  TypeDef *extraout_RDX_08;
  UI_STRING *uis_07;
  UI_STRING *type_03;
  UI_STRING *extraout_RDX_09;
  UI_STRING *extraout_RDX_10;
  TypeDef *type_04;
  TypeDef *type_05;
  UI_STRING *uis_08;
  UI_STRING *extraout_RDX_11;
  UI_STRING *pUVar37;
  UI_STRING *extraout_RDX_12;
  UI_STRING *extraout_RDX_13;
  UI_STRING *uis_09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *include;
  pointer pbVar38;
  _Alloc_hider _Var39;
  ifstream *includes;
  string_view *name;
  method_signature *filename;
  UI *ui;
  string *in_R8;
  anon_class_1_0_00000001 *in_R9;
  cache *pcVar40;
  TypeDef *type;
  _Base_ptr type_06;
  interface_info *type_07;
  size_type sVar41;
  _State_baseV2 *__tmp;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::TypeDef,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::TypeDef>_>_>
  *__range4;
  bool bVar42;
  TypeDef TVar43;
  coded_index<winmd::reader::TypeDefOrRef> cVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  path *ppVar48;
  anon_class_8_1_89897ddb *rest_6;
  string_view type_name;
  bool local_679;
  size_t fast_abi_size;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_670;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_668;
  string license_arg;
  string_view local_628;
  string base_type_argument;
  string_view type_namespace;
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [15];
  __allocator_type __a2;
  string external_requires;
  path output_folder;
  __allocator_type __a2_1;
  undefined8 local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  cache c;
  undefined8 local_468;
  get_interfaces_t base_interfaces;
  anon_class_8_1_89897ddb_conflict1 local_440;
  reader args;
  ifstream template_file;
  const_iterator cStack_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  undefined1 local_3e8 [168];
  bool local_340;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  local_320 [12];
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> classes;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_main_cpp:360:27)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_main_cpp:360:27)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_1d8;
  writer ixx;
  task_group group;
  anon_class_8_1_89897ddb local_f0;
  anon_class_8_1_89897ddb local_e8;
  anon_class_8_1_89897ddb local_e0;
  anon_class_8_1_89897ddb local_d8;
  writer w;
  
  writer::writer(&w,(UI *)argv,in_RDX);
  lVar21 = std::chrono::_V2::system_clock::now();
  reader::reader<int,char**,22ul>(&args,argc,argv,(option (*) [22])options);
  if (args.m_options._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    _template_file = (pointer)0x4;
    cStack_400._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167942;
    bVar15 = reader::exists(&args,(string_view *)&template_file);
    if (!bVar15) {
      output_folder._M_pathname._M_dataplus._M_p = (pointer)0x1;
      output_folder._M_pathname._M_string_length =
           (long)"((\\d+)\\.(\\d+)\\.(\\d+)\\.(\\d+))\\+?" + 0x1e;
      bVar15 = reader::exists(&args,(string_view *)&output_folder);
      if (!bVar15) {
        _template_file = (pointer)0x7;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167b45;
        settings[0xa9] = reader::exists(&args,(string_view *)&template_file);
        _template_file = (pointer)0x7;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167db6;
        settings[0x1d0] = reader::exists(&args,(string_view *)&template_file);
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x5;
        output_folder._M_pathname._M_string_length =
             (long)"One or more prefixes to exclude from input" + 0x25;
        reader::files<bool(*)(std::basic_string_view<char,std::char_traits<char>>const&)>
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&template_file,&args,(string_view *)&output_folder,
                   winmd::reader::database::is_database);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)settings,
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&template_file);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&template_file);
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x9;
        output_folder._M_pathname._M_string_length = (long)"invalid back reference" + 0xd;
        reader::files<bool(*)(std::basic_string_view<char,std::char_traits<char>>const&)>
                  ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&template_file,&args,(string_view *)&output_folder,
                   winmd::reader::database::is_database);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(settings + 0x30),
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&template_file);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&template_file);
        _template_file = (pointer)0x9;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167ac7;
        settings[0xaa] = reader::exists(&args,(string_view *)&template_file);
        _template_file = (pointer)0x4;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167cb0;
        settings[0x80] = reader::exists(&args,(string_view *)&template_file);
        _template_file = (pointer)0x7;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167d79;
        settings[0x81] = reader::exists(&args,(string_view *)&template_file);
        _template_file = (pointer)0x8;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167dad;
        settings[0xa8] = reader::exists(&args,(string_view *)&template_file);
        license_arg._M_dataplus._M_p = (pointer)0x6;
        license_arg._M_string_length = (size_type)anon_var_dwarf_9d384;
        _Stack_670._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)".";
        fast_abi_size = 1;
        reader::value_abi_cxx11_
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &template_file,&args,(string_view *)&license_arg,(string_view *)&fast_abi_size);
        std::filesystem::__cxx11::path::path
                  (&output_folder,(string_type *)&template_file,auto_format);
        std::__cxx11::string::~string((string *)&template_file);
        std::filesystem::__cxx11::path::path<char[11],std::filesystem::__cxx11::path>
                  ((path *)&ixx,(char (*) [11])"winrt/impl",auto_format);
        std::filesystem::__cxx11::operator/((path *)&template_file,&output_folder,(path *)&ixx);
        std::filesystem::create_directories((path *)&template_file);
        std::filesystem::__cxx11::path::~path((path *)&template_file);
        std::filesystem::__cxx11::path::~path((path *)&ixx);
        std::filesystem::canonical((path *)&template_file);
        std::filesystem::__cxx11::path::string((string *)&ixx,(path *)&template_file);
        std::__cxx11::string::operator=((string *)(settings + 0x60),(string *)&ixx);
        std::__cxx11::string::~string((string *)&ixx);
        std::filesystem::__cxx11::path::~path((path *)&template_file);
        std::__cxx11::string::push_back('8');
        _template_file = (pointer)0x7;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167c43;
        pvVar22 = reader::values_abi_cxx11_(&args,(string_view *)&template_file);
        pbVar5 = (pvVar22->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar38 = (pvVar22->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar38 != pbVar5;
            pbVar38 = pbVar38 + 1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)(settings + 0x140),pbVar38);
        }
        _template_file = (pointer)0x6;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167d72;
        pvVar22 = reader::values_abi_cxx11_(&args,(string_view *)&template_file);
        pbVar5 = (pvVar22->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar38 = (pvVar22->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar38 != pbVar5;
            pbVar38 = pbVar38 + 1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)(settings + 0x140),pbVar38);
        }
        _template_file = (pointer)0x7;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167c7d;
        pvVar22 = reader::values_abi_cxx11_(&args,(string_view *)&template_file);
        pbVar5 = (pvVar22->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar38 = (pvVar22->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start; pbVar38 != pbVar5;
            pbVar38 = pbVar38 + 1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)(settings + 0x170),pbVar38);
        }
        if (settings[0x81] != '\0') {
          _template_file = (pointer)0x7;
          cStack_400._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167d79;
          ixx.super_writer_base<cppwinrt::writer>.m_second.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_ =
               ZEXT816(0);
          reader::value_abi_cxx11_
                    (&license_arg,&args,(string_view *)&template_file,(string_view *)&ixx);
          if (license_arg._M_string_length == 0) {
            std::__cxx11::string::assign(settings + 0x88);
          }
          else {
            std::filesystem::__cxx11::path::
            path<std::__cxx11::string,std::filesystem::__cxx11::path>
                      ((path *)&ixx,&license_arg,auto_format);
            std::filesystem::absolute((path *)&c);
            std::ifstream::ifstream
                      (&template_file,
                       (char *)c.m_databases.
                               super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                               ._M_impl._M_node.super__List_node_base._M_next,_S_in);
            std::filesystem::__cxx11::path::~path((path *)&c);
            if ((local_3e8[*(long *)(_template_file + -0x18)] & 5) != 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&fast_abi_size,"Cannot read license template file \'",
                         (allocator<char> *)&external_requires);
              std::filesystem::absolute((path *)&c);
              std::filesystem::__cxx11::path::string((string *)&__a2_1,(path *)&c);
              std::operator+(&base_type_argument,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &__a2_1,"\'");
              throw_invalid<std::__cxx11::string>((string *)&fast_abi_size,&base_type_argument);
            }
            c.m_databases.
            super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
            _M_impl._M_node.super__List_node_base._M_next =
                 (_List_node_base *)
                 &c.m_databases.
                  super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                  ._M_impl._M_node._M_size;
            c.m_databases.
            super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
            _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
            c.m_databases.
            super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
            _M_impl._M_node._M_size =
                 c.m_databases.
                 super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                 ._M_impl._M_node._M_size & 0xffffffffffffff00;
            while (piVar23 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                       ((istream *)&template_file,(string *)&c),
                  ((byte)piVar23[*(long *)(*(long *)piVar23 + -0x18) + 0x20] & 5) == 0) {
              if (c.m_databases.
                  super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                  ._M_impl._M_node.super__List_node_base._M_prev != (_List_node_base *)0x0) {
                std::__cxx11::string::append(settings + 0x88);
                std::__cxx11::string::append((string *)(settings + 0x88));
              }
              std::__cxx11::string::append(settings + 0x88);
            }
            std::__cxx11::string::~string((string *)&c);
            std::ifstream::~ifstream(&template_file);
            std::filesystem::__cxx11::path::~path((path *)&ixx);
          }
          std::__cxx11::string::~string((string *)&license_arg);
        }
        if (settings[0xaa] == '\x01') {
          _template_file = (pointer)0x9;
          cStack_400._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167b70;
          settings[0x111] = reader::exists(&args,(string_view *)&template_file);
          ixx.super_writer_base<cppwinrt::writer>.m_second.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
               (pointer)0x4;
          ixx.super_writer_base<cppwinrt::writer>.m_second.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
               = "name";
          c.m_databases.
          super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
          c.m_databases.
          super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
          _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
          reader::value_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &template_file,&args,(string_view *)&ixx,(string_view *)&c);
          std::__cxx11::string::operator=((string *)(settings + 0xd0),(string *)&template_file);
          std::__cxx11::string::~string((string *)&template_file);
          if (settings._216_8_ == 0) {
            _template_file = (pointer)0x5;
            cStack_400._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167caa;
            pvVar22 = reader::values_abi_cxx11_(&args,(string_view *)&template_file);
            __source = (pvVar22->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            if (__source !=
                (pvVar22->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
              std::filesystem::__cxx11::path::
              path<std::__cxx11::string,std::filesystem::__cxx11::path>
                        ((path *)&ixx,__source,auto_format);
              std::filesystem::__cxx11::path::filename((path *)&template_file,(path *)&ixx);
              std::filesystem::__cxx11::path::path((path *)&c);
              ppVar24 = (path *)std::filesystem::__cxx11::path::replace_extension
                                          ((path *)&template_file);
              std::filesystem::__cxx11::path::string(&license_arg,ppVar24);
              std::__cxx11::string::operator=((string *)(settings + 0xd0),(string *)&license_arg);
              std::__cxx11::string::~string((string *)&license_arg);
              std::filesystem::__cxx11::path::~path((path *)&c);
              std::filesystem::__cxx11::path::~path((path *)&template_file);
              std::filesystem::__cxx11::path::~path((path *)&ixx);
            }
          }
          ixx.super_writer_base<cppwinrt::writer>.m_second.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
               (pointer)0x3;
          ixx.super_writer_base<cppwinrt::writer>.m_second.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
               = "pch";
          c.m_databases.
          super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x5;
          c.m_databases.
          super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
          _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)anon_var_dwarf_9d6a3;
          reader::value_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &template_file,&args,(string_view *)&ixx,(string_view *)&c);
          std::__cxx11::string::operator=((string *)(settings + 0xf0),(string *)&template_file);
          std::__cxx11::string::~string((string *)&template_file);
          _template_file = (pointer)0x6;
          cStack_400._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167b9e;
          settings[0x110] = reader::exists(&args,(string_view *)&template_file);
          ixx.super_writer_base<cppwinrt::writer>.m_second.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
               (pointer)0x7;
          ixx.super_writer_base<cppwinrt::writer>.m_second.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
               = "library";
          c.m_databases.
          super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x5;
          c.m_databases.
          super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
          _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)anon_var_dwarf_9d6af;
          reader::value_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &template_file,&args,(string_view *)&ixx,(string_view *)&c);
          std::__cxx11::string::operator=((string *)(settings + 0x118),(string *)&template_file);
          std::__cxx11::string::~string((string *)&template_file);
          _template_file = (pointer)0x8;
          cStack_400._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167cd5;
          settings[0x138] = reader::exists(&args,(string_view *)&template_file);
          _template_file = (pointer)0xf;
          cStack_400._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167dbe;
          settings[0x139] = reader::exists(&args,(string_view *)&template_file);
          bVar15 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)(settings + 0xf0),".");
          if (bVar15) {
            settings._248_8_ = 0;
            *(undefined1 *)settings._240_8_ = 0;
          }
          _template_file = (pointer)0x9;
          cStack_400._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167ac7;
          ixx.super_writer_base<cppwinrt::writer>.m_second.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_ =
               ZEXT816(0);
          reader::value_abi_cxx11_
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,&args,
                     (string_view *)&template_file,(string_view *)&ixx);
          if (c.m_databases.
              super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
              _M_impl._M_node.super__List_node_base._M_prev != (_List_node_base *)0x0) {
            std::filesystem::__cxx11::path::
            path<std::__cxx11::string,std::filesystem::__cxx11::path>
                      ((path *)&template_file,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                       auto_format);
            std::filesystem::create_directories((path *)&template_file);
            std::filesystem::__cxx11::path::~path((path *)&template_file);
            std::filesystem::__cxx11::path::
            path<std::__cxx11::string,std::filesystem::__cxx11::path>
                      ((path *)&ixx,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&c,
                       auto_format);
            std::filesystem::canonical((path *)&template_file);
            std::filesystem::__cxx11::path::string(&license_arg,(path *)&template_file);
            std::__cxx11::string::operator=((string *)(settings + 0xb0),(string *)&license_arg);
            std::__cxx11::string::~string((string *)&license_arg);
            std::filesystem::__cxx11::path::~path((path *)&template_file);
            std::filesystem::__cxx11::path::~path((path *)&ixx);
            std::__cxx11::string::push_back(-0x78);
          }
          std::__cxx11::string::~string((string *)&c);
        }
        std::filesystem::__cxx11::path::~path(&output_folder);
        _template_file = (pointer)0x0;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_3f8._M_allocated_capacity = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &template_file,(const_iterator)0x0,
                   (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )settings._24_8_,
                   (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )0x23b8e0);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &template_file,cStack_400,
                   (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )settings._72_8_,
                   (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )0x23b910);
        cVar13._M_current = cStack_400._M_current;
        c.m_databases.
        super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>._M_impl.
        _M_node.super__List_node_base._M_next = (_List_node_base *)&c;
        c.m_databases.
        super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>._M_impl.
        _M_node._M_size = 0;
        c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header;
        c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header;
        c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        c.m_databases.
        super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>._M_impl.
        _M_node.super__List_node_base._M_prev =
             c.m_databases.
             super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>.
             _M_impl._M_node.super__List_node_base._M_next;
        c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             c.m_nested_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        for (_Var39._M_p = _template_file;
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var39._M_p !=
            cVar13._M_current; _Var39._M_p = _Var39._M_p + 0x20) {
          output_folder._M_pathname._M_dataplus._M_p = (pointer)&c;
          pvVar25 = std::__cxx11::
                    list<winmd::reader::database,std::allocator<winmd::reader::database>>::
                    emplace_back<std::__cxx11::string_const&,winmd::reader::cache*>
                              ((list<winmd::reader::database,std::allocator<winmd::reader::database>>
                                *)output_folder._M_pathname._M_dataplus._M_p,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               _Var39._M_p,(cache **)&output_folder);
          output_folder._M_pathname._M_string_length =
               output_folder._M_pathname._M_string_length & 0xffffffff00000000;
          uVar3 = (pvVar25->TypeDef).super_table_base.m_row_count;
          uVar19 = 0;
          output_folder._M_pathname._M_dataplus._M_p = (pointer)&pvVar25->TypeDef;
          while (((table<winmd::reader::TypeDef> *)output_folder._M_pathname._M_dataplus._M_p !=
                  &pvVar25->TypeDef || (uVar19 != uVar3))) {
            TVar18 = winmd::reader::TypeDef::Flags((TypeDef *)&output_folder);
            if ((TVar18.super_AttributesBase<unsigned_int>.value != 0) &&
               ((bVar15 = winmd::reader::is_nested((TypeDef *)&output_folder), !bVar15 &&
                (TVar18 = winmd::reader::TypeDef::Flags((TypeDef *)&output_folder),
                ((uint)TVar18.super_AttributesBase<unsigned_int>.value >> 0xe & 1) != 0)))) {
              ixx.super_writer_base<cppwinrt::writer>.m_second.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_
                   = winmd::reader::TypeDef::TypeNamespace((TypeDef *)&output_folder);
              this = std::
                     map<std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::cache::namespace_members>_>_>
                     ::operator[](&c.m_namespaces,(key_type *)&ixx);
              ixx.super_writer_base<cppwinrt::writer>.m_second.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_16_
                   = winmd::reader::TypeDef::TypeName((TypeDef *)&output_folder);
              std::
              map<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeDef,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,winmd::reader::TypeDef>>>
              ::try_emplace<winmd::reader::TypeDef_const&>
                        ((map<std::basic_string_view<char,std::char_traits<char>>,winmd::reader::TypeDef,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,winmd::reader::TypeDef>>>
                          *)this,(key_type *)&ixx,(TypeDef *)&output_folder);
            }
            uVar19 = (int)output_folder._M_pathname._M_string_length + 1;
            output_folder._M_pathname._M_string_length =
                 CONCAT44(output_folder._M_pathname._M_string_length._4_4_,uVar19);
          }
          output_folder._M_pathname._M_string_length =
               output_folder._M_pathname._M_string_length & 0xffffffff00000000;
          uVar3 = (pvVar25->NestedClass).super_table_base.m_row_count;
          uVar19 = 0;
          output_folder._M_pathname._M_dataplus._M_p = (pointer)&pvVar25->NestedClass;
          while (((table<winmd::reader::NestedClass> *)output_folder._M_pathname._M_dataplus._M_p !=
                  &pvVar25->NestedClass || (uVar19 != uVar3))) {
            TVar43 = winmd::reader::NestedClass::EnclosingType((NestedClass *)&output_folder);
            ixx.super_writer_base<cppwinrt::writer>.m_second.
            super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._0_12_ =
                 TVar43.super_row_base<winmd::reader::TypeDef>._0_12_;
            this_00 = std::
                      map<winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>,_std::less<winmd::reader::TypeDef>,_std::allocator<std::pair<const_winmd::reader::TypeDef,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>_>
                      ::operator[](&c.m_nested_types,(key_type *)&ixx);
            TVar43 = winmd::reader::NestedClass::NestedType((NestedClass *)&output_folder);
            license_arg._M_dataplus._M_p =
                 (pointer)TVar43.super_row_base<winmd::reader::TypeDef>.m_table;
            license_arg._M_string_length =
                 CONCAT44(license_arg._M_string_length._4_4_,
                          TVar43.super_row_base<winmd::reader::TypeDef>.m_index);
            std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
            emplace_back<winmd::reader::TypeDef>(this_00,(TypeDef *)&license_arg);
            uVar19 = (int)output_folder._M_pathname._M_string_length + 1;
            output_folder._M_pathname._M_string_length =
                 CONCAT44(output_folder._M_pathname._M_string_length._4_4_,uVar19);
          }
        }
        for (p_Var27 = c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var27 != &c.m_namespaces._M_t._M_impl.super__Rb_tree_header;
            p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27)) {
          for (p_Var26 = p_Var27[2]._M_parent; p_Var26 != (_Rb_tree_node_base *)&p_Var27[1]._M_right
              ; p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
            winmd::reader::cache::add_type_to_members
                      (&c,(TypeDef *)&p_Var26[1]._M_left,(namespace_members *)&p_Var27[1]._M_left);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&template_file);
        _template_file = (pointer)0x12;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165b7a;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x8;
        output_folder._M_pathname._M_string_length = (long)"Windows.Foundation.DateTime" + 0x13;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x12;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165b7a;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x16;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9a7b5;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x12;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165b7a;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x7;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9a7f5;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x12;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165b7a;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x5;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9a873;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x12;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165b7a;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x4;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9a899;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x12;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165b7a;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x4;
        output_folder._M_pathname._M_string_length = (long)" __%Size" + 4;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x12;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165b7a;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x8;
        output_folder._M_pathname._M_string_length = (long)"Windows.Foundation.TimeSpan" + 0x13;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x1b;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165bb7;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x9;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9a8c9;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x1b;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165bb7;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x9;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9a8ef;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x1b;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165bb7;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x5;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9a907;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x1b;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165bb7;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0xa;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9a91f;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x1b;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165bb7;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x7;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9a945;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x1b;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165bb7;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x7;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9a96b;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        _template_file = (pointer)0x1b;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x165bb7;
        output_folder._M_pathname._M_dataplus._M_p = (pointer)0x7;
        output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9a983;
        winmd::reader::cache::remove_type
                  (&c,(string_view *)&template_file,(string_view *)&output_folder);
        if (settings._88_8_ != 0) {
          local_3f8._8_8_ = &cStack_400;
          cStack_400._M_current = cStack_400._M_current & 0xffffffff00000000;
          local_3f8._M_allocated_capacity = 0;
          local_3e8._8_8_ = (pointer)0x0;
          local_3e8._0_8_ = local_3f8._8_8_;
          for (p_Var26 = (_Rb_tree_node_base *)settings._24_8_;
              p_Var26 != (_Rb_tree_node_base *)(settings + 8);
              p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
            std::__cxx11::string::string((string *)&output_folder,(string *)(p_Var26 + 1));
            pcVar40 = &c;
            do {
              pcVar40 = (cache *)(pcVar40->m_databases).
                                 super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                                 ._M_impl._M_node.super__List_node_base._M_next;
              if (pcVar40 == &c) break;
              _Var16 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&pcVar40[0xd].m_namespaces,&output_folder._M_pathname);
            } while (!_Var16);
            psVar2 = &pcVar40[1].m_databases.
                      super__List_base<winmd::reader::database,_std::allocator<winmd::reader::database>_>
                      ._M_impl._M_node._M_size;
            license_arg._M_string_length = license_arg._M_string_length & 0xffffffff00000000;
            _Var4 = pcVar40[1].m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
            _Var20 = _S_red;
            license_arg._M_dataplus._M_p = (pointer)psVar2;
            while (((size_t *)license_arg._M_dataplus._M_p != psVar2 || (_Var20 != _Var4))) {
              TVar18 = winmd::reader::TypeDef::Flags((TypeDef *)&license_arg);
              if (((uint)TVar18.super_AttributesBase<unsigned_int>.value >> 0xe & 1) != 0) {
                _fast_abi_size = winmd::reader::TypeDef::TypeNamespace((TypeDef *)&license_arg);
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&ixx,
                           (basic_string_view<char,_std::char_traits<char>_> *)&fast_abi_size,
                           (allocator<char> *)&base_type_argument);
                std::__cxx11::string::push_back((char)&ixx);
                _fast_abi_size = winmd::reader::TypeDef::TypeName((TypeDef *)&license_arg);
                std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
                          ((string *)&ixx,
                           (basic_string_view<char,_std::char_traits<char>_> *)&fast_abi_size);
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&template_file,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ixx
                          );
                std::__cxx11::string::~string((string *)&ixx);
              }
              _Var20 = (int)license_arg._M_string_length + _S_black;
              license_arg._M_string_length = CONCAT44(license_arg._M_string_length._4_4_,_Var20);
            }
            std::__cxx11::string::~string((string *)&output_folder);
          }
          output_folder._M_pathname.field_2._8_8_ = &output_folder._M_pathname._M_string_length;
          output_folder._M_pathname._M_dataplus._M_p = (pointer)0x0;
          output_folder._M_pathname._M_string_length = 0;
          output_folder._M_pathname.field_2._M_allocated_capacity = 0;
          output_folder._32_8_ = output_folder._M_pathname.field_2._8_8_;
          winmd::reader::filter::
          filter<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((filter *)&ixx,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&template_file,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&output_folder);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::_M_move_assign((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                            *)(settings + 0x1a0),&ixx);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     *)&ixx);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&output_folder);
          includes = (ifstream *)(settings + 0x140);
          if (settings._360_8_ == 0) {
            includes = &template_file;
          }
          winmd::reader::filter::
          filter<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    ((filter *)&output_folder,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)includes,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(settings + 0x170));
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::_M_move_assign((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                            *)(settings + 0x1b8),&output_folder);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                     *)&output_folder);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&template_file);
        }
        bVar15 = true;
        if (settings[0x80] == '\0') {
          if (settings[0xaa] == '\0') {
            bVar15 = settings._416_8_ == settings._424_8_;
          }
          else {
            bVar15 = false;
          }
        }
        settings[0x80] = bVar15;
        if (settings[0x1d0] == '\x01') {
          for (p_Var27 = c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var27 != &c.m_namespaces._M_t._M_impl.super__Rb_tree_header;
              p_Var27 = (_Base_ptr)std::_Rb_tree_increment(p_Var27)) {
            p_Var6 = *(_Base_ptr *)(p_Var27 + 4);
            for (type_06 = p_Var27[3]._M_right; type_06 != p_Var6;
                type_06 = (_Base_ptr)&type_06->_M_left) {
              bVar15 = has_fastabi((TypeDef *)type_06);
              if (bVar15) {
                cVar44 = get_default_interface((TypeDef *)type_06);
                iVar35 = ((uint)(cVar44.super_typed_index<winmd::reader::TypeDefOrRef>.
                                 super_index_base<winmd::reader::TypeDefOrRef>._8_8_ >> 2) &
                         0x3fffffff) - 1;
                if (((undefined1  [16])
                     cVar44.super_typed_index<winmd::reader::TypeDefOrRef>.
                     super_index_base<winmd::reader::TypeDefOrRef> & (undefined1  [16])0x3) ==
                    (undefined1  [16])0x0) {
                  _template_file =
                       (pointer)&(cVar44.super_typed_index<winmd::reader::TypeDefOrRef>.
                                  super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database
                                 ->TypeDef;
                  cStack_400._M_current._0_4_ = iVar35;
                  std::
                  map<winmd::reader::TypeDef,winmd::reader::TypeDef,std::less<winmd::reader::TypeDef>,std::allocator<std::pair<winmd::reader::TypeDef_const,winmd::reader::TypeDef>>>
                  ::try_emplace<winmd::reader::TypeDef_const&>
                            ((map<winmd::reader::TypeDef,winmd::reader::TypeDef,std::less<winmd::reader::TypeDef>,std::allocator<std::pair<winmd::reader::TypeDef_const,winmd::reader::TypeDef>>>
                              *)(settings + 0x1d8),(key_type *)&template_file,(TypeDef *)type_06);
                }
                else {
                  output_folder._M_pathname._M_dataplus._M_p =
                       (pointer)(cVar44.super_typed_index<winmd::reader::TypeDefOrRef>.
                                 super_index_base<winmd::reader::TypeDefOrRef>.m_table)->m_database;
                  output_folder._M_pathname._M_string_length =
                       CONCAT44(output_folder._M_pathname._M_string_length._4_4_,iVar35);
                  TVar43 = winmd::reader::find_required((TypeRef *)&output_folder);
                  _template_file = (pointer)TVar43.super_row_base<winmd::reader::TypeDef>.m_table;
                  cStack_400._M_current._0_4_ =
                       TVar43.super_row_base<winmd::reader::TypeDef>.m_index;
                  std::
                  map<winmd::reader::TypeDef,winmd::reader::TypeDef,std::less<winmd::reader::TypeDef>,std::allocator<std::pair<winmd::reader::TypeDef_const,winmd::reader::TypeDef>>>
                  ::try_emplace<winmd::reader::TypeDef_const&>
                            ((map<winmd::reader::TypeDef,winmd::reader::TypeDef,std::less<winmd::reader::TypeDef>,std::allocator<std::pair<winmd::reader::TypeDef_const,winmd::reader::TypeDef>>>
                              *)(settings + 0x1d8),(key_type *)&template_file,(TypeDef *)type_06);
                }
              }
            }
          }
        }
        if (settings[0xa9] == '\x01') {
          output_folder._M_pathname._M_dataplus._M_p = *argv;
          _template_file = (pointer)0xa;
          cStack_400._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167947;
          writer_base<cppwinrt::writer>::write_segment<char*>
                    (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
                     (char **)&output_folder);
          _template_file = (pointer)0xa;
          cStack_400._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167952;
          writer_base<cppwinrt::writer>::write_segment<char[8]>
                    (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
                     (char (*) [8])"2.3.4.5");
          for (p_Var26 = (_Rb_tree_node_base *)settings._24_8_;
              p_Var26 != (_Rb_tree_node_base *)(settings + 8);
              p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
            _template_file = (pointer)0xa;
            cStack_400._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167965;
            writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                      (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var26 + 1));
          }
          for (p_Var26 = (_Rb_tree_node_base *)settings._72_8_;
              p_Var26 != (_Rb_tree_node_base *)(settings + 0x38);
              p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
            _template_file = (pointer)0xa;
            cStack_400._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167970;
            writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                      (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var26 + 1));
          }
          _template_file = (pointer)0xa;
          cStack_400._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x16797b;
          writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                    (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (settings + 0x60));
          if (settings._184_8_ != 0) {
            _template_file = (pointer)0xa;
            cStack_400._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167986;
            writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                      (&w.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (settings + 0xb0));
          }
        }
        writer_base<cppwinrt::writer>::flush_to_console(&w.super_writer_base<cppwinrt::writer>,true)
        ;
        group.m_tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        group._17_8_ = 0;
        group.m_tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        group.m_tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
        _M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        group.m_tasks.super__Vector_base<std::future<void>,_std::allocator<std::future<void>_>_>.
        _M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        name = (string_view *)&template_file;
        _template_file = (pointer)0xb;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167991;
        bVar15 = reader::exists(&args,name);
        group.m_synchronous = bVar15;
        writer::writer(&ixx,(UI *)name,uis);
        write_preamble(&ixx);
        _template_file = (pointer)0x8;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x16799d;
        writer_base<cppwinrt::writer>::write_impl
                  (&ixx.super_writer_base<cppwinrt::writer>,(string_view *)&template_file);
        _template_file =
             (pointer)strlen(
                            "\n#include <intrin.h>\n#include <algorithm>\n#include <array>\n#include <atomic>\n#include <charconv>\n#include <chrono>\n#include <cstddef>\n#include <cstring>\n#include <iterator>\n#include <map>\n#include <memory>\n#include <optional>\n#include <stdexcept>\n#include <string_view>\n#include <string>\n#include <thread>\n#include <tuple>\n#include <type_traits>\n#include <unordered_map>\n#include <utility>\n#include <vector>\n\n#if __has_include(<version>)\n#include <version>\n#endif\n\n#if __has_include(<windowsnumerics.impl.h>)\n#define WINRT_IMPL_NUMERICS\n#include <directxmath.h>\n#endif\n\n#ifndef WINRT_LEAN_AND_MEAN\n#include <ostream>\n#endif\n\n#ifdef __cpp_lib_format\n#include <format>\n#endif\n\n#ifdef __cpp_lib_source_location\n#include <source_location>\n#endif\n\n#ifdef __cpp_lib_coroutine\n\n#include <coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::coroutine_handle<T>;\n\n    using suspend_always = std::suspend_always;\n    using suspend_never = std::suspend_never;\n}\n\n#elif __has_include(<experimental/coroutine>)\n\n#include <experimental/coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::experimental::coroutine_handle<T>;\n\n    using suspend_always = std::experimental::suspend_always;\n    using suspend_never = std::experimental::suspend_never;\n}\n\n#else\n#error C++/WinRT requires coroutine support, which is currently missing. Try enabling C++20 in your compiler.\n#endif\n"
                            );
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1fac20;
        writer_base<cppwinrt::writer>::write_impl
                  (&ixx.super_writer_base<cppwinrt::writer>,(string_view *)&template_file);
        filename = (method_signature *)&template_file;
        _template_file = (pointer)0x33;
        cStack_400._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1679a6;
        writer_base<cppwinrt::writer>::write_impl
                  (&ixx.super_writer_base<cppwinrt::writer>,(string_view *)filename);
        auVar45._8_8_ = extraout_RDX;
        auVar45._0_8_ = c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          pUVar37 = auVar45._8_8_;
          p_Var26 = auVar45._0_8_;
          if ((_Rb_tree_header *)p_Var26 == &c.m_namespaces._M_t._M_impl.super__Rb_tree_header)
          break;
          members = &p_Var26[1]._M_left;
          bVar15 = has_projected_types((namespace_members *)members);
          if ((bVar15) &&
             (filename = (method_signature *)members,
             bVar15 = winmd::reader::filter::includes
                                ((filter *)(settings + 0x1a0),(namespace_members *)members), bVar15)
             ) {
            p_Var1 = p_Var26 + 1;
            _template_file = (pointer)0x15;
            cStack_400._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1679da;
            filename = (method_signature *)&template_file;
            writer_base<cppwinrt::writer>::
            write_segment<std::basic_string_view<char,std::char_traits<char>>>
                      (&ixx.super_writer_base<cppwinrt::writer>,(string_view *)&template_file,
                       (basic_string_view<char,_std::char_traits<char>_> *)p_Var1);
            local_3f8._M_allocated_capacity = (size_type)&c;
            _template_file = (pointer)p_Var1;
            cStack_400._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)members;
            if (group.m_synchronous == true) {
              std::
              _Head_base<0UL,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/main.cpp:360:27),_false>
              ::anon_class_24_3_41b5e664_for__M_head_impl::operator()
                        ((anon_class_24_3_41b5e664_for__M_head_impl *)&template_file);
            }
            else {
              license_arg._M_dataplus._M_p = (pointer)0x0;
              license_arg._M_string_length = 0;
              p_Var28 = (pointer)operator_new(0x60);
              local_1d8._M_alloc = &__a2;
              (p_Var28->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
              (p_Var28->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
              (p_Var28->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
                   (_func_int **)&PTR___Sp_counted_ptr_inplace_0023a748;
              *(undefined8 *)((long)&(p_Var28->_M_impl)._M_storage._M_storage + 8) = 0;
              *(undefined4 *)((long)&(p_Var28->_M_impl)._M_storage._M_storage + 0x10) = 0;
              (p_Var28->_M_impl)._M_storage._M_storage.__data[0x14] = '\0';
              *(undefined4 *)((long)&(p_Var28->_M_impl)._M_storage._M_storage + 0x18) = 0;
              *(undefined8 *)((long)&(p_Var28->_M_impl)._M_storage._M_storage + 0x20) = 0;
              *(undefined4 *)((long)&(p_Var28->_M_impl)._M_storage._M_storage + 0x28) = 0;
              (p_Var28->_M_impl)._M_storage._M_storage.__align =
                   (anon_struct_8_0_00000001_for___align)&PTR___Async_state_impl_0023a798;
              local_1d8._M_ptr = p_Var28;
              p_Var29 = (_Result<void> *)operator_new(0x10);
              *(undefined8 *)p_Var29 = 0;
              *(undefined8 *)&p_Var29->field_0x8 = 0;
              std::__future_base::_Result<void>::_Result(p_Var29);
              *(_Result<void> **)((long)&(p_Var28->_M_impl)._M_storage._M_storage + 0x30) = p_Var29;
              *(pointer *)((long)&(p_Var28->_M_impl)._M_storage._M_storage + 0x38) = _template_file;
              *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               ((long)&(p_Var28->_M_impl)._M_storage._M_storage + 0x40) = cStack_400._M_current;
              *(size_type *)((long)&(p_Var28->_M_impl)._M_storage._M_storage + 0x48) =
                   local_3f8._M_allocated_capacity;
              output_folder._M_pathname._M_dataplus._M_p = (pointer)0x0;
              local_468 = operator_new(0x20);
              *(undefined ***)local_468 = &PTR___State_0023a7f0;
              *(_Impl **)(local_468 + 8) = &p_Var28->_M_impl;
              *(code **)(local_468 + 0x10) =
                   std::__future_base::
                   _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/main.cpp:360:27)>_>,_void>
                   ::_M_run;
              *(long *)(local_468 + 0x18) = 0;
              std::thread::_M_start_thread(&output_folder,&local_468,0);
              if ((long *)local_468 != (long *)0x0) {
                (**(code **)(*(long *)local_468 + 8))();
              }
              std::thread::operator=
                        ((thread *)((long)&(p_Var28->_M_impl)._M_storage._M_storage + 0x20),
                         (thread *)&output_folder);
              std::thread::~thread((thread *)&output_folder);
              local_1d8._M_ptr = (pointer)0x0;
              std::
              __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/main.cpp:360:27)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/main.cpp:360:27)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
              ::~__allocated_ptr(&local_1d8);
              _fast_abi_size = (string_view)ZEXT816(0);
              output_folder._M_pathname._M_dataplus = license_arg._M_dataplus;
              output_folder._M_pathname._M_string_length = license_arg._M_string_length;
              license_arg._M_dataplus._M_p = (pointer)&p_Var28->_M_impl;
              license_arg._M_string_length = (size_type)p_Var28;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &output_folder._M_pathname._M_string_length);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_670);
              if (license_arg._M_dataplus._M_p == (pointer)0x0) {
                puVar30 = (undefined8 *)operator_new(0x50);
                output_folder._M_pathname._M_dataplus._M_p = (pointer)&__a2_1;
                puVar30[1] = 0x100000001;
                *puVar30 = &PTR___Sp_counted_ptr_inplace_0023a830;
                puVar30[3] = 0;
                *(undefined4 *)(puVar30 + 4) = 0;
                *(undefined1 *)((long)puVar30 + 0x24) = 0;
                *(undefined4 *)(puVar30 + 5) = 0;
                puVar30[2] = &PTR___Deferred_state_0023a880;
                output_folder._M_pathname._M_string_length = (size_type)puVar30;
                p_Var29 = (_Result<void> *)operator_new(0x10);
                *(undefined8 *)p_Var29 = 0;
                *(undefined8 *)&p_Var29->field_0x8 = 0;
                std::__future_base::_Result<void>::_Result(p_Var29);
                puVar30[6] = p_Var29;
                puVar30[7] = _template_file;
                puVar30[8] = cStack_400._M_current;
                puVar30[9] = local_3f8._M_allocated_capacity;
                output_folder._M_pathname._M_string_length = 0;
                std::
                __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/main.cpp:360:27)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/main.cpp:360:27)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_main_cpp:360:27)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_main_cpp:360:27)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                                    *)&output_folder);
                _fast_abi_size = (string_view)ZEXT816(0);
                output_folder._M_pathname._M_dataplus = license_arg._M_dataplus;
                output_folder._M_pathname._M_string_length = license_arg._M_string_length;
                license_arg._M_dataplus._M_p = (pointer)(puVar30 + 2);
                license_arg._M_string_length = (size_type)puVar30;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                           &output_folder._M_pathname._M_string_length);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_670);
              }
              filename = (method_signature *)&base_type_argument;
              std::__basic_future<void>::__basic_future
                        ((__basic_future<void> *)filename,(__state_type *)&license_arg);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&license_arg._M_string_length
                        );
              std::vector<std::future<void>,std::allocator<std::future<void>>>::
              emplace_back<std::future<void>>
                        ((vector<std::future<void>,std::allocator<std::future<void>>> *)&group,
                         (future<void> *)filename);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &base_type_argument._M_string_length);
            }
          }
          auVar45 = std::_Rb_tree_increment(p_Var26);
        }
        if (settings[0x80] != '\0') {
          writer::writer((writer *)&template_file,(UI *)filename,pUVar37);
          write_preamble((writer *)&template_file);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen("#define CPPWINRT_VERSION \"%\"\n\n");
          output_folder._M_pathname._M_string_length = (size_type)strings::base_version_odr;
          writer_base<cppwinrt::writer>::write_segment<char[8]>
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder,
                     (char (*) [8])"2.3.4.5");
          output_folder._M_pathname._M_dataplus._M_p = (pointer)0x4;
          output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_a24a7;
          write_open_file_guard((writer *)&template_file,(string_view *)&output_folder,'\0');
          license_arg._M_string_length = (size_type)write_close_file_guard;
          license_arg._M_dataplus._M_p = (pointer)&template_file;
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\n#include <intrin.h>\n#include <algorithm>\n#include <array>\n#include <atomic>\n#include <charconv>\n#include <chrono>\n#include <cstddef>\n#include <cstring>\n#include <iterator>\n#include <map>\n#include <memory>\n#include <optional>\n#include <stdexcept>\n#include <string_view>\n#include <string>\n#include <thread>\n#include <tuple>\n#include <type_traits>\n#include <unordered_map>\n#include <utility>\n#include <vector>\n\n#if __has_include(<version>)\n#include <version>\n#endif\n\n#if __has_include(<windowsnumerics.impl.h>)\n#define WINRT_IMPL_NUMERICS\n#include <directxmath.h>\n#endif\n\n#ifndef WINRT_LEAN_AND_MEAN\n#include <ostream>\n#endif\n\n#ifdef __cpp_lib_format\n#include <format>\n#endif\n\n#ifdef __cpp_lib_source_location\n#include <source_location>\n#endif\n\n#ifdef __cpp_lib_coroutine\n\n#include <coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::coroutine_handle<T>;\n\n    using suspend_always = std::suspend_always;\n    using suspend_never = std::suspend_never;\n}\n\n#elif __has_include(<experimental/coroutine>)\n\n#include <experimental/coroutine>\n\nnamespace winrt::impl\n{\n    template <typename T = void>\n    using coroutine_handle = std::experimental::coroutine_handle<T>;\n\n    using suspend_always = std::experimental::suspend_always;\n    using suspend_never = std::experimental::suspend_never;\n}\n\n#else\n#error C++/WinRT requires coroutine support, which is currently missing. Try enabling C++20 in your compiler.\n#endif\n"
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_includes;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\n#ifdef _DEBUG\n\n#define WINRT_ASSERT _ASSERTE\n#define WINRT_VERIFY WINRT_ASSERT\n#define WINRT_VERIFY_(result, expression) WINRT_ASSERT(result == expression)\n\n#else\n\n#define WINRT_ASSERT(expression) ((void)0)\n#define WINRT_VERIFY(expression) (void)(expression)\n#define WINRT_VERIFY_(result, expression) (void)(expression)\n\n#endif\n\n#define WINRT_IMPL_SHIM(...) (*(abi_t<__VA_ARGS__>**)&static_cast<__VA_ARGS__ const&>(static_cast<D const&>(*this)))\n\n#ifdef _MSC_VER\n// Note: this is a workaround for a false-positive warning produced by the Visual C++ 15.9 compiler.\n#pragma warning(disable : 5046)\n\n// Note: this is a workaround for a false-positive warning produced by the Visual C++ 16.3 compiler.\n#pragma warning(disable : 4268)\n#endif\n\n#if defined(__cpp_lib_coroutine) || defined(__cpp_coroutines) || defined(_RESUMABLE_FUNCTIONS_SUPPORTED)\n#define WINRT_IMPL_COROUTINES\n#endif\n\n#ifndef WINRT_EXPORT\n#define WINRT_EXPORT\n#endif\n\n#ifdef WINRT_IMPL_NUMERICS\n#define _WINDOWS_NUMERICS_NAMESPACE_ winrt::Windows::Foundation::Numerics\n#define _WINDOWS_NUMERICS_BEGIN_NAMESPACE_ WINRT_EXPORT namespace winrt::Windows::Foundation::Numerics\n#define _WINDOWS_NUMERICS_END_NAMESPACE_\n#include <windowsnumerics.impl.h>\n#undef _WINDOWS_NUMERICS_NAMESPACE_\n#undef _WINDOWS_NUMERICS_BEGIN_NAMESPACE_\n#undef _WINDOWS_NUMERICS_END_NAMESPACE_\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_NOINLINE __declspec(noinline)\n#elif defined(__GNUC__)\n#define WINRT_IMPL_NOINLINE __attribute__((noinline))\n#else\n#define WINRT_IMPL_NOINLINE\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_EMPTY_BASES __declspec(empty_bases)\n#else\n#define WINRT_IMPL_EMPTY_BASES\n#endif\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_NOVTABLE __declspec(novtable)\n#else\n#define WINRT_IMPL_NOVTABLE\n#endif\n\n#if defined(__clang__)\n#define WINRT_IMPL_HAS_DECLSPEC_UUID __has_declspec_attribute(uuid)\n#elif defined(_MSC_VER)\n#define WINRT_IMPL_HAS_DECLSPEC_UUID 1\n#else\n#define WINRT_IMPL_HAS_DECLSPEC_UUID 0\n#endif\n\n#ifdef __IUnknown_INTERFACE_DEFINED__\n#define WINRT_IMPL_IUNKNOWN_DEFINED\n#els..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_macros;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nnamespace winrt::impl\n{\n    using ptp_io = struct tp_io*;\n    using ptp_timer = struct tp_timer*;\n    using ptp_wait = struct tp_wait*;\n    using ptp_pool = struct tp_pool*;\n    using srwlock = struct srwlock_*;\n    using condition_variable = struct condition_variable_*;\n    using bstr = wchar_t*;\n\n    using filetime_period = std::ratio_multiply<std::ratio<100>, std::nano>;\n    struct IAgileObject;\n\n    struct com_callback_args\n    {\n        uint32_t reserved1;\n        uint32_t reserved2;\n        void* data;\n    };\n\n    template <typename T>\n    constexpr uint8_t hex_to_uint(T const c)\n    {\n        if (c >= \'0\' && c <= \'9\')\n        {\n            return static_cast<uint8_t>(c - \'0\');\n        }\n        else if (c >= \'A\' && c <= \'F\')\n        {\n            return static_cast<uint8_t>(10 + c - \'A\');\n        }\n        else if (c >= \'a\' && c <= \'f\')\n        {\n            return static_cast<uint8_t>(10 + c - \'a\');\n        }\n        else \n        {\n            throw std::invalid_argument(\"Character is not a hexadecimal digit\");\n        }\n    }\n\n    template <typename T>\n    constexpr uint8_t hex_to_uint8(T const a, T const b)\n    {\n        return (hex_to_uint(a) << 4) | hex_to_uint(b);\n    }\n\n    constexpr uint16_t uint8_to_uint16(uint8_t a, uint8_t b)\n    {\n        return (static_cast<uint16_t>(a) << 8) | static_cast<uint16_t>(b);\n    }\n\n    constexpr uint32_t uint8_to_uint32(uint8_t a, uint8_t b, uint8_t c, uint8_t d)\n    {\n        return (static_cast<uint32_t>(uint8_to_uint16(a, b)) << 16) |\n                static_cast<uint32_t>(uint8_to_uint16(c, d));\n    }\n}\n\nWINRT_EXPORT namespace winrt\n{\n    struct event_token;\n    struct hstring;\n    struct clock;\n\n    struct hresult\n    {\n        int32_t value{};\n\n        constexpr hresult() noexcept = default;\n\n        constexpr hresult(int32_t const value) noexcept : value(value)\n        {\n        }\n\n        constexpr operator int32_t() const noexcept\n        {\n            return value;\n        }\n    };\n\n    struct guid\n    {\n    private:\n\n        template <typename TStringVi..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_types;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\n__declspec(selectany) int32_t(__stdcall* winrt_to_hresult_handler)(void* address) noexcept {};\n__declspec(selectany) winrt::hstring(__stdcall* winrt_to_message_handler)(void* address) {};\n__declspec(selectany) void(__stdcall* winrt_throw_hresult_handler)(uint32_t lineNumber, char const* fileName, char const* functionName, void* returnAddress, winrt::hresult const result) noexcept {};\n__declspec(selectany) int32_t(__stdcall* winrt_activation_handler)(void* classId, winrt::guid const& iid, void** factory) noexcept {};\n\n#if defined(_MSC_VER)\n#ifdef _M_HYBRID\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:#WINRT_IMPL_\" #function \"@\" #count \"=#\" #function \"@\" #count))\n#elif _M_ARM64EC\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:#WINRT_IMPL_\" #function \"=#\" #function))\n#elif _M_IX86\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:_WINRT_IMPL_\" #function \"@\" #count \"=_\" #function \"@\" #count))\n#else\n#define WINRT_IMPL_LINK(function, count) __pragma(comment(linker, \"/alternatename:WINRT_IMPL_\" #function \"=\" #function))\n#endif\n#elif defined(__GNUC__)\n#if defined(__i386__)\n#define WINRT_IMPL_LINK(function, count) __asm__(\"_\" #function \"@\" #count)\n#else\n#define WINRT_IMPL_LINK(function, count) __asm__(#function)\n#endif\n#endif\n\nextern \"C\"\n{\n    void* __stdcall WINRT_IMPL_LoadLibraryW(wchar_t const* name) noexcept WINRT_IMPL_LINK(LoadLibraryW, 4);\n    int32_t __stdcall WINRT_IMPL_FreeLibrary(void* library) noexcept WINRT_IMPL_LINK(FreeLibrary, 4);\n    void* __stdcall WINRT_IMPL_GetProcAddress(void* library, char const* name) noexcept WINRT_IMPL_LINK(GetProcAddress, 8);\n\n    int32_t __stdcall WINRT_IMPL_SetErrorInfo(uint32_t reserved, void* info) noexcept WINRT_IMPL_LINK(SetErrorInfo, 8);\n    int32_t __stdcall WINRT_IMPL_GetErrorInfo(uint32_t reserved, void** info) noexcept WINRT_IMPL_LINK(GetErrorInfo, 8);\n    int32_t __stdcall WINRT_IMPL_CoInitializeEx(void*, uint32_t type) noexcept WINRT_IMPL_LINK(CoInitializeEx, 8);\n ..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_extern;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n    hresult check_hresult(hresult const result WINRT_IMPL_SOURCE_LOCATION_ARGS);\n    hresult to_hresult() noexcept;\n\n    template <typename D, typename I>\n    D* get_self(I const& from) noexcept;\n\n    struct take_ownership_from_abi_t {};\n    inline constexpr take_ownership_from_abi_t take_ownership_from_abi{};\n\n    template <typename T>\n    struct com_ptr;\n\n    namespace param\n    {\n        template <typename T>\n        struct iterable;\n\n        template <typename T>\n        struct async_iterable;\n\n        template <typename K, typename V>\n        struct map_view;\n\n        template <typename K, typename V>\n        struct async_map_view;\n\n        template <typename K, typename V>\n        struct map;\n\n        template <typename T>\n        struct vector_view;\n\n        template <typename T>\n        struct async_vector_view;\n\n        template <typename T>\n        struct vector;\n    }\n}\n\nnamespace winrt::impl\n{\n    using namespace std::literals;\n\n    template <typename T>\n    struct reference_traits;\n\n    template <typename T>\n    struct identity\n    {\n        using type = T;\n    };\n\n    template <typename T, typename Enable = void>\n    struct abi\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    struct abi<T, std::enable_if_t<std::is_enum_v<T>>>\n    {\n        using type = std::underlying_type_t<T>;\n    };\n\n    template <typename T>\n    using abi_t = typename abi<T>::type;\n\n    template <typename T>\n    struct consume;\n\n    template <typename D, typename I = D>\n    using consume_t = typename consume<I>::template type<D>;\n\n    template <typename T, typename H>\n    struct delegate;\n\n    template <typename T, typename = std::void_t<>>\n    struct default_interface\n    {\n        using type = T;\n    };\n\n    struct basic_category;\n    struct interface_category;\n    struct delegate_category;\n    struct enum_category;\n    struct class_category;\n\n    template <typename T>\n    struct category\n    {\n        using type = void;\n    };\n\n    template <typename T>\n    using category_t =..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_meta;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    using default_interface = typename impl::default_interface<T>::type;\n\n    template <typename T>\n    constexpr guid const& guid_of() noexcept\n    {\n        return impl::guid_v<default_interface<T>>;\n    }\n\n    template <typename... T>\n    bool is_guid_of(guid const& id) noexcept\n    {\n        return ((id == guid_of<T>()) || ...);\n    }\n}\n\nnamespace winrt::impl\n{\n    template <size_t Size, typename T, size_t... Index>\n    constexpr std::array<T, Size> to_array(T const* value, std::index_sequence<Index...> const) noexcept\n    {\n        return { value[Index]... };\n    }\n\n    template <typename T, size_t Size>\n    constexpr auto to_array(std::array<T, Size> const& value) noexcept\n    {\n        return value;\n    }\n\n    template <size_t Size>\n    constexpr auto to_array(char const(&value)[Size]) noexcept\n    {\n        return to_array<Size - 1>(value, std::make_index_sequence<Size - 1>());\n    }\n\n    template <size_t Size>\n    constexpr auto to_array(wchar_t const(&value)[Size]) noexcept\n    {\n        return to_array<Size - 1>(value, std::make_index_sequence<Size - 1>());\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize, size_t... LeftIndex, size_t... RightIndex>\n    constexpr std::array<T, LeftSize + RightSize> concat(\n        [[maybe_unused]] std::array<T, LeftSize> const& left,\n        [[maybe_unused]] std::array<T, RightSize> const& right,\n        std::index_sequence<LeftIndex...> const,\n        std::index_sequence<RightIndex...> const) noexcept\n    {\n        return { left[LeftIndex]..., right[RightIndex]... };\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize>\n    constexpr auto concat(std::array<T, LeftSize> const& left, std::array<T, RightSize> const& right) noexcept\n    {\n        return concat(left, right, std::make_index_sequence<LeftSize>(), std::make_index_sequence<RightSize>());\n    }\n\n    template <typename T, size_t LeftSize, size_t RightSize>\n    constexpr auto concat(std::array<T, LeftSize> const& left, T cons..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_identity;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct handle_type\n    {\n        using type = typename T::type;\n\n        handle_type() noexcept = default;\n\n        explicit handle_type(type value) noexcept : m_value(value)\n        {\n        }\n\n        handle_type(handle_type&& other) noexcept : m_value(other.detach())\n        {\n        }\n\n        handle_type& operator=(handle_type&& other) noexcept\n        {\n            if (this != &other)\n            {\n                attach(other.detach());\n            }\n\n            return*this;\n        }\n\n        ~handle_type() noexcept\n        {\n            close();\n        }\n\n        void close() noexcept\n        {\n            if (*this)\n            {\n                T::close(m_value);\n                m_value = T::invalid();\n            }\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return T::invalid() != m_value;\n        }\n\n        type get() const noexcept\n        {\n            return m_value;\n        }\n\n        type* put() noexcept\n        {\n            close();\n            return &m_value;\n        }\n\n        void attach(type value) noexcept\n        {\n            close();\n            *put() = value;\n        }\n\n        type detach() noexcept\n        {\n            type value = m_value;\n            m_value = T::invalid();\n            return value;\n        }\n\n        friend void swap(handle_type& left, handle_type& right) noexcept\n        {\n            std::swap(left.m_value, right.m_value);\n        }\n\n    private:\n\n        type m_value = T::invalid();\n    };\n\n    struct handle_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_VERIFY_(1, WINRT_IMPL_CloseHandle(value));\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using handle = handle_type<handle_traits>;\n\n    struct file_handle_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n          ..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_handle;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n    struct slim_condition_variable;\n\n    struct slim_mutex\n    {\n        slim_mutex(slim_mutex const&) = delete;\n        slim_mutex& operator=(slim_mutex const&) = delete;\n        slim_mutex() noexcept = default;\n\n        void lock() noexcept\n        {\n            WINRT_IMPL_AcquireSRWLockExclusive(&m_lock);\n        }\n\n        void lock_shared() noexcept\n        {\n            WINRT_IMPL_AcquireSRWLockShared(&m_lock);\n        }\n\n        bool try_lock() noexcept\n        {\n            return 0 != WINRT_IMPL_TryAcquireSRWLockExclusive(&m_lock);\n        }\n\n        bool try_lock_shared() noexcept\n        {\n            return 0 != WINRT_IMPL_TryAcquireSRWLockShared(&m_lock);\n        }\n\n        void unlock() noexcept\n        {\n            WINRT_IMPL_ReleaseSRWLockExclusive(&m_lock);\n        }\n\n        void unlock_shared() noexcept\n        {\n            WINRT_IMPL_ReleaseSRWLockShared(&m_lock);\n        }\n\n    private:\n        friend slim_condition_variable;\n\n        auto get() noexcept\n        {\n            return &m_lock;\n        }\n\n        impl::srwlock m_lock{};\n    };\n\n    struct slim_lock_guard\n    {\n        explicit slim_lock_guard(slim_mutex& m) noexcept :\n        m_mutex(m)\n        {\n            m_mutex.lock();\n        }\n\n        slim_lock_guard(slim_lock_guard const&) = delete;\n\n        ~slim_lock_guard() noexcept\n        {\n            m_mutex.unlock();\n        }\n\n    private:\n        slim_mutex& m_mutex;\n    };\n\n    struct slim_shared_lock_guard\n    {\n        explicit slim_shared_lock_guard(slim_mutex& m) noexcept :\n            m_mutex(m)\n        {\n            m_mutex.lock_shared();\n        }\n\n        slim_shared_lock_guard(slim_shared_lock_guard const&) = delete;\n\n        ~slim_shared_lock_guard() noexcept\n        {\n            m_mutex.unlock_shared();\n        }\n\n    private:\n        slim_mutex& m_mutex;\n    };\n\n    struct slim_condition_variable\n    {\n        slim_condition_variable(slim_condition_variable const&) = delete;\n        slim_condition_variable const& operator=(slim_c..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_lock;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nnamespace winrt::impl\n{\n    template <> struct abi<Windows::Foundation::IUnknown>\n    {\n        struct WINRT_IMPL_NOVTABLE type\n        {\n            virtual int32_t __stdcall QueryInterface(guid const& id, void** object) noexcept = 0;\n            virtual uint32_t __stdcall AddRef() noexcept = 0;\n            virtual uint32_t __stdcall Release() noexcept = 0;\n        };\n    };\n\n    using unknown_abi = abi_t<Windows::Foundation::IUnknown>;\n\n    template <> struct abi<Windows::Foundation::IInspectable>\n    {\n        struct WINRT_IMPL_NOVTABLE type : unknown_abi\n        {\n            virtual int32_t __stdcall GetIids(uint32_t* count, guid** ids) noexcept = 0;\n            virtual int32_t __stdcall GetRuntimeClassName(void** name) noexcept = 0;\n            virtual int32_t __stdcall GetTrustLevel(Windows::Foundation::TrustLevel* level) noexcept = 0;\n        };\n    };\n\n    using inspectable_abi = abi_t<Windows::Foundation::IInspectable>;\n\n    template <> struct abi<Windows::Foundation::IActivationFactory>\n    {\n        struct WINRT_IMPL_NOVTABLE type : inspectable_abi\n        {\n            virtual int32_t __stdcall ActivateInstance(void** instance) noexcept = 0;\n        };\n    };\n\n    struct WINRT_IMPL_NOVTABLE IAgileObject : unknown_abi {};\n\n    struct WINRT_IMPL_NOVTABLE IAgileReference : unknown_abi\n    {\n        virtual int32_t __stdcall Resolve(guid const& id, void** object) noexcept = 0;\n    };\n\n    struct WINRT_IMPL_NOVTABLE IMarshal : unknown_abi\n    {\n        virtual int32_t __stdcall GetUnmarshalClass(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, guid* pCid) noexcept = 0;\n        virtual int32_t __stdcall GetMarshalSizeMax(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, uint32_t* pSize) noexcept = 0;\n        virtual int32_t __stdcall MarshalInterface(void* pStm, guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags) noexcept = 0;\n        virtual int32_t __stdcall UnmarshalInterface(..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_abi;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nnamespace winrt::impl\n{\n#ifdef WINRT_DIAGNOSTICS\n\n    struct factory_diagnostics_info\n    {\n        bool is_agile{ true };\n        uint32_t requests{ 0 };\n    };\n\n    struct diagnostics_info\n    {\n        std::map<std::wstring_view, uint32_t> queries;\n        std::map<std::wstring_view, factory_diagnostics_info> factories;\n    };\n\n    struct diagnostics_cache\n    {\n        template <typename T>\n        void add_query()\n        {\n            slim_lock_guard const guard(m_lock);\n            ++m_info.queries[name_of<T>()];\n        }\n\n        template <typename T>\n        void add_factory()\n        {\n            slim_lock_guard const guard(m_lock);\n            factory_diagnostics_info& factory = m_info.factories[name_of<T>()];\n            ++factory.requests;\n        }\n\n        template <typename T>\n        void non_agile_factory()\n        {\n            slim_lock_guard const guard(m_lock);\n            factory_diagnostics_info& factory = m_info.factories[name_of<T>()];\n            factory.is_agile = false;\n        }\n\n        auto get()\n        {\n            slim_lock_guard const guard(m_lock);\n            return m_info;\n        }\n\n        auto detach()\n        {\n            slim_lock_guard const guard(m_lock);\n            return std::move(m_info);\n        }\n\n    private:\n\n        slim_mutex m_lock;\n        diagnostics_info m_info;\n    };\n\n    inline diagnostics_cache& get_diagnostics_info() noexcept\n    {\n        static diagnostics_cache info;\n        return info;\n    }\n\n#endif\n\n    template <typename T>\n    using com_ref = std::conditional_t<std::is_base_of_v<Windows::Foundation::IUnknown, T>, T, com_ptr<T>>;\n\n    template <typename T, std::enable_if_t<is_implements_v<T>, int> = 0>\n    com_ref<T> wrap_as_result(void* result)\n    {\n        return { &static_cast<produce<T, typename default_interface<T>::type>*>(result)->shim(), take_ownership_from_abi };\n    }\n\n    template <typename T, std::enable_if_t<!is_implements_v<T>, int> = 0>\n    com_ref<T> wrap_as_result(void* result)\n    {\n        return { result, take_owners..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_windows;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct com_ptr;\n}\n\nnamespace winrt::impl\n{\n    template <typename T, typename F, typename...Args>\n    int32_t capture_to(void**result, F function, Args&& ...args)\n    {\n        return function(args..., guid_of<T>(), result);\n    }\n\n    template <typename T, typename O, typename M, typename...Args, std::enable_if_t<std::is_class_v<O> || std::is_union_v<O>, int> = 0>\n    int32_t capture_to(void** result, O* object, M method, Args&& ...args)\n    {\n        return (object->*method)(args..., guid_of<T>(), result);\n    }\n\n    template <typename T, typename O, typename M, typename...Args>\n    int32_t capture_to(void** result, com_ptr<O> const& object, M method, Args&& ...args);\n}\n\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct com_ptr\n    {\n        using type = impl::abi_t<T>;\n\n        com_ptr(std::nullptr_t = nullptr) noexcept {}\n\n        com_ptr(void* ptr, take_ownership_from_abi_t) noexcept : m_ptr(static_cast<type*>(ptr))\n        {\n        }\n\n        com_ptr(com_ptr const& other) noexcept : m_ptr(other.m_ptr)\n        {\n            add_ref();\n        }\n\n        template <typename U>\n        com_ptr(com_ptr<U> const& other) noexcept : m_ptr(other.m_ptr)\n        {\n            add_ref();\n        }\n\n        template <typename U>\n        com_ptr(com_ptr<U>&& other) noexcept : m_ptr(std::exchange(other.m_ptr, {}))\n        {\n        }\n\n        ~com_ptr() noexcept\n        {\n            release_ref();\n        }\n\n        com_ptr& operator=(com_ptr const& other) noexcept\n        {\n            copy_ref(other.m_ptr);\n            return*this;\n        }\n\n        com_ptr& operator=(com_ptr&& other) noexcept\n        {\n            if (this != &other)\n            {\n                release_ref();\n                m_ptr = std::exchange(other.m_ptr, {});\n            }\n\n            return*this;\n        }\n\n        template <typename U>\n        com_ptr& operator=(com_ptr<U> const& other) noexcept\n        {\n            copy_ref(other.m_ptr);\n            return*th..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_com_ptr;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nnamespace winrt::impl\n{\n    struct atomic_ref_count\n    {\n        atomic_ref_count() noexcept = default;\n\n        explicit atomic_ref_count(uint32_t count) noexcept : m_count(count)\n        {\n        }\n\n        uint32_t operator=(uint32_t count) noexcept\n        {\n            return m_count = count;\n        }\n\n        uint32_t operator++() noexcept\n        {\n            return static_cast<uint32_t>(m_count.fetch_add(1, std::memory_order_relaxed) + 1);\n        }\n\n        uint32_t operator--() noexcept\n        {\n            auto const remaining = m_count.fetch_sub(1, std::memory_order_release) - 1;\n\n            if (remaining == 0)\n            {\n                std::atomic_thread_fence(std::memory_order_acquire);\n            }\n            else if (remaining < 0)\n            {\n                abort();\n            }\n\n            return static_cast<uint32_t>(remaining);\n        }\n\n        operator uint32_t() const noexcept\n        {\n            return static_cast<uint32_t>(m_count);\n        }\n\n    private:\n\n        std::atomic<int32_t> m_count;\n    };\n\n    constexpr uint32_t hstring_reference_flag{ 1 };\n\n    struct hstring_header\n    {\n        uint32_t flags;\n        uint32_t length;\n        uint32_t padding1;\n        uint32_t padding2;\n        wchar_t const* ptr;\n    };\n\n    struct shared_hstring_header : hstring_header\n    {\n        atomic_ref_count count;\n        wchar_t buffer[1];\n    };\n\n    inline void release_hstring(hstring_header* handle) noexcept\n    {\n        WINRT_ASSERT((handle->flags & hstring_reference_flag) == 0);\n\n        if (0 == --static_cast<shared_hstring_header*>(handle)->count)\n        {\n            WINRT_IMPL_HeapFree(WINRT_IMPL_GetProcessHeap(), 0, handle);\n        }\n    }\n\n    inline shared_hstring_header* precreate_hstring_on_heap(uint32_t length)\n    {\n        WINRT_ASSERT(length != 0);\n        uint64_t bytes_required = static_cast<uint64_t>(sizeof(shared_hstring_header)) + static_cast<uint64_t>(sizeof(wchar_t)) * static_cast<uint64_t>(length);\n\n        if (bytes_required > UINT_MAX)\n      ..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_string;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt::param\n{\n    struct hstring\n    {\n#ifdef _MSC_VER\n#pragma warning(suppress: 26495)\n#endif\n        hstring() noexcept : m_handle(nullptr) {}\n        hstring(hstring const& values) = delete;\n        hstring& operator=(hstring const& values) = delete;\n        hstring(std::nullptr_t) = delete;\n\n#ifdef _MSC_VER\n#pragma warning(suppress: 26495)\n#endif\n        hstring(winrt::hstring const& value) noexcept : m_handle(get_abi(value))\n        {\n        }\n\n        hstring(std::wstring_view const& value) noexcept\n        {\n            create_string_reference(value.data(), value.size());\n        }\n\n        hstring(std::wstring const& value) noexcept\n        {\n            create_string_reference(value.data(), value.size());\n        }\n\n        hstring(wchar_t const* const value) noexcept\n        {\n            create_string_reference(value, wcslen(value));\n        }\n\n        operator winrt::hstring const&() const noexcept\n        {\n            return *reinterpret_cast<winrt::hstring const*>(this);\n        }\n\n    private:\n        void create_string_reference(wchar_t const* const data, size_t size) noexcept\n        {\n            WINRT_ASSERT(size < UINT_MAX);\n            auto size32 = static_cast<uint32_t>(size);\n\n            if (size32 == 0)\n            {\n                m_handle = nullptr;\n            }\n            else\n            {\n                impl::create_hstring_on_stack(m_header, data, size32);\n                m_handle = &m_header;\n            }\n        }\n\n        void* m_handle;\n        impl::hstring_header m_header;\n    };\n\n    inline void* get_abi(hstring const& object) noexcept\n    {\n        return *(void**)(&object);\n    }\n}\n\nnamespace winrt::impl\n{\n    template <typename T>\n    using param_type = std::conditional_t<std::is_same_v<T, hstring>, param::hstring, T>;\n}\n"
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_string_input;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n    inline bool operator==(hstring const& left, hstring const& right) noexcept\n    {\n        return std::wstring_view(left) == std::wstring_view(right);\n    }\n\n    inline bool operator==(hstring const& left, std::wstring const& right) noexcept\n    {\n        return std::wstring_view(left) == right;\n    }\n\n    inline bool operator==(std::wstring const& left, hstring const& right) noexcept\n    {\n        return left == std::wstring_view(right);\n    }\n\n    inline bool operator==(hstring const& left, wchar_t const* right) noexcept\n    {\n        return std::wstring_view(left) == right;\n    }\n\n    inline bool operator==(wchar_t const* left, hstring const& right) noexcept\n    {\n        return left == std::wstring_view(right);\n    }\n\n    bool operator==(hstring const& left, std::nullptr_t) = delete;\n\n    bool operator==(std::nullptr_t, hstring const& right) = delete;\n\n    inline bool operator<(hstring const& left, hstring const& right) noexcept\n    {\n        return std::wstring_view(left) < std::wstring_view(right);\n    }\n\n    inline bool operator<(std::wstring const& left, hstring const& right) noexcept\n    {\n        return left < std::wstring_view(right);\n    }\n\n    inline bool operator<(hstring const& left, std::wstring const& right) noexcept\n    {\n        return std::wstring_view(left) < right;\n    }\n\n    inline bool operator<(hstring const& left, wchar_t const* right) noexcept\n    {\n        return std::wstring_view(left) < right;\n    }\n\n    inline bool operator<(wchar_t const* left, hstring const& right) noexcept\n    {\n        return left < std::wstring_view(right);\n    }\n\n    bool operator<(hstring const& left, std::nullptr_t) = delete;\n\n    bool operator<(std::nullptr_t, hstring const& right) = delete;\n    inline bool operator!=(hstring const& left, hstring const& right) noexcept { return !(left == right); }\n    inline bool operator>(hstring const& left, hstring const& right) noexcept { return right < left; }\n    inline bool operator<=(hstring const& left, hstring const& right) noexce..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_string_operators;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct array_view\n    {\n        using value_type = T;\n        using size_type = uint32_t;\n        using reference = value_type&;\n        using const_reference = value_type const&;\n        using pointer = value_type*;\n        using const_pointer = value_type const*;\n        using iterator = value_type*;\n        using const_iterator = value_type const*;\n        using reverse_iterator = std::reverse_iterator<iterator>;\n        using const_reverse_iterator = std::reverse_iterator<const_iterator>;\n\n        array_view() noexcept = default;\n\n        array_view(pointer data, size_type size) noexcept :\n            m_data(data),\n            m_size(size)\n        {}\n\n        array_view(pointer first, pointer last) noexcept :\n            m_data(first),\n            m_size(static_cast<size_type>(last - first))\n        {}\n\n        array_view(std::initializer_list<value_type> value) noexcept :\n            array_view(value.begin(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename C, size_type N>\n        array_view(C(&value)[N]) noexcept :\n            array_view(value, N)\n        {}\n\n        template <typename C>\n        array_view(std::vector<C>& value) noexcept :\n            array_view(data(value), static_cast<size_type>(value.size()))\n        {\n        }\n\n        template <typename C>\n        array_view(std::vector<C> const& value) noexcept :\n            array_view(data(value), static_cast<size_type>(value.size()))\n        {\n        }\n\n        template <typename C, size_t N>\n        array_view(std::array<C, N>& value) noexcept :\n            array_view(value.data(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename C, size_t N>\n        array_view(std::array<C, N> const& value) noexcept :\n            array_view(value.data(), static_cast<size_type>(value.size()))\n        {}\n\n        template <typename OtherType>\n        array_view(array_view<OtherType> const& other,\n            std::enable_if_t<std::is_convertible_v<..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_array;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n    template <typename T>\n    struct weak_ref\n    {\n        weak_ref(std::nullptr_t = nullptr) noexcept {}\n\n        template<typename U = impl::com_ref<T> const&, typename = std::enable_if_t<std::is_convertible_v<U&&, impl::com_ref<T> const&>>>\n        weak_ref(U&& object)\n        {\n            from_com_ref(static_cast<impl::com_ref<T> const&>(object));\n        }\n\n        [[nodiscard]] auto get() const noexcept\n        {\n            if (!m_ref)\n            {\n                return impl::com_ref<T>{ nullptr };\n            }\n\n            if constexpr(impl::is_implements_v<T>)\n            {\n                impl::com_ref<default_interface<T>> temp;\n                m_ref->Resolve(guid_of<T>(), put_abi(temp));\n                void* result = nullptr;\n                if (temp) {\n                    result = get_self<T>(temp);\n                    detach_abi(temp);\n                }\n                return impl::com_ref<T>{ result, take_ownership_from_abi };\n            }\n            else\n            {\n                void* result{};\n                m_ref->Resolve(guid_of<T>(), &result);\n                return impl::com_ref<T>{ result, take_ownership_from_abi };\n            }\n        }\n\n        auto put() noexcept\n        {\n            return m_ref.put();\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return static_cast<bool>(m_ref);\n        }\n\n    private:\n\n        template<typename U>\n        void from_com_ref(U&& object)\n        {\n            if (object)\n            {\n                if constexpr (impl::is_implements_v<T>)\n                {\n                    m_ref = std::move(object->get_weak().m_ref);\n                }\n                else\n                {\n                    // An access violation (crash) on the following line means that the object does not support weak references.\n                    // Avoid using weak_ref/auto_revoke with such objects.\n                    check_hresult(object.template try_as<impl::IWeakReferenceSource>()->GetWeakRe..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_weak_ref;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n#if defined (WINRT_NO_MODULE_LOCK)\n\n    // Defining WINRT_NO_MODULE_LOCK is appropriate for apps (executables) or pinned DLLs (that don\'t support unloading)\n    // and can thus avoid the synchronization overhead imposed by the default module lock.\n\n    constexpr auto get_module_lock() noexcept\n    {\n        struct lock\n        {\n            constexpr uint32_t operator++() noexcept\n            {\n                return 1;\n            }\n\n            constexpr uint32_t operator--() noexcept\n            {\n                return 0;\n            }\n\n            constexpr explicit operator bool() noexcept\n            {\n                return true;\n            }\n        };\n\n        return lock{};\n    }\n\n#elif defined (WINRT_CUSTOM_MODULE_LOCK)\n\n    // When WINRT_CUSTOM_MODULE_LOCK is defined, you must provide an implementation of winrt::get_module_lock()\n    // that returns an object that implements operator++ and operator--.\n\n#else\n\n    // This is the default implementation for use with DllCanUnloadNow.\n\n    inline impl::atomic_ref_count& get_module_lock() noexcept\n    {\n        static impl::atomic_ref_count s_lock;\n        return s_lock;\n    }\n\n#endif\n}\n\nnamespace winrt::impl\n{\n    template<bool UseModuleLock>\n    struct module_lock_updater;\n\n    template<>\n    struct module_lock_updater<true>\n    {\n        module_lock_updater() noexcept\n        {\n            ++get_module_lock();\n        }\n\n        ~module_lock_updater() noexcept\n        {\n            --get_module_lock();\n        }\n    };\n\n    template<>\n    struct module_lock_updater<false> {};\n\n    using update_module_lock = module_lock_updater<true>;\n\n    struct agile_ref_fallback final : IAgileReference, update_module_lock\n    {\n        agile_ref_fallback(com_ptr<IGlobalInterfaceTable>&& git, uint32_t cookie) noexcept :\n            m_git(std::move(git)),\n            m_cookie(cookie)\n        {\n        }\n\n        ~agile_ref_fallback() noexcept\n        {\n            m_git->RevokeInterfaceFromGlobal(m_cookie);\n        }\n\n        int32_t __s..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_agile_ref;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\n#if defined(_MSC_VER)\n#define WINRT_IMPL_RETURNADDRESS() _ReturnAddress()\n#elif defined(__GNUC__)\n#define WINRT_IMPL_RETURNADDRESS() __builtin_extract_return_addr(__builtin_return_address(0))\n#else\n#define WINRT_IMPL_RETURNADDRESS() nullptr\n#endif\n\nnamespace winrt::impl\n{\n    struct heap_traits\n    {\n        using type = wchar_t*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_VERIFY(WINRT_IMPL_HeapFree(WINRT_IMPL_GetProcessHeap(), 0, value));\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    struct bstr_traits\n    {\n        using type = wchar_t*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_IMPL_SysFreeString(value);\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using bstr_handle = handle_type<bstr_traits>;\n\n    inline hstring trim_hresult_message(wchar_t const* const message, uint32_t size) noexcept\n    {\n        wchar_t const* back = message + size - 1;\n\n        while (size&& iswspace(*back))\n        {\n            --size;\n            --back;\n        }\n\n        return { message, size };\n    }\n\n    inline hstring message_from_hresult(hresult code) noexcept\n    {\n        handle_type<impl::heap_traits> message;\n\n        uint32_t const size = WINRT_IMPL_FormatMessageW(0x00001300, // FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM | FORMAT_MESSAGE_IGNORE_INSERTS\n            nullptr,\n            code,\n            0x00000400, // MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT)\n            reinterpret_cast<wchar_t*>(message.put()),\n            0,\n            nullptr);\n\n        return trim_hresult_message(message.get(), size);\n    }\n\n    constexpr int32_t hresult_from_win32(uint32_t const x) noexcept\n    {\n        return (int32_t)(x) <= 0 ? (int32_t)(x) : (int32_t)(((x) & 0x0000FFFF) | (7 << 16) | 0x80000000);\n    }\n\n    constexpr int32_t hresult_from_nt(uint32_t const x) noexcept\n    {\n        return ((int32_t)((..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_error;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nnamespace winrt::impl\n{\n    inline int32_t make_marshaler(unknown_abi* outer, void** result) noexcept\n    {\n        struct marshaler final : IMarshal\n        {\n            marshaler(unknown_abi* object) noexcept\n            {\n                m_object.copy_from(object);\n            }\n\n            int32_t __stdcall QueryInterface(guid const& id, void** object) noexcept final\n            {\n                if (is_guid_of<IMarshal>(id))\n                {\n                    *object = static_cast<IMarshal*>(this);\n                    AddRef();\n                    return 0;\n                }\n\n                return m_object->QueryInterface(id, object);\n            }\n\n            uint32_t __stdcall AddRef() noexcept final\n            {\n                return ++m_references;\n            }\n\n            uint32_t __stdcall Release() noexcept final\n            {\n                auto const remaining = --m_references;\n\n                if (remaining == 0)\n                {\n                    delete this;\n                }\n\n                return remaining;\n            }\n\n            int32_t __stdcall GetUnmarshalClass(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, guid* pCid) noexcept final\n            {\n                if (m_marshaler)\n                {\n                    return m_marshaler->GetUnmarshalClass(riid, pv, dwDestContext, pvDestContext, mshlflags, pCid);\n                }\n\n                return error_bad_alloc;\n            }\n\n            int32_t __stdcall GetMarshalSizeMax(guid const& riid, void* pv, uint32_t dwDestContext, void* pvDestContext, uint32_t mshlflags, uint32_t* pSize) noexcept final\n            {\n                if (m_marshaler)\n                {\n                    return m_marshaler->GetMarshalSizeMax(riid, pv, dwDestContext, pvDestContext, mshlflags, pSize);\n                }\n\n                return error_bad_alloc;\n            }\n\n            int32_t __stdcall MarshalInterface(void* pStm, guid const& riid, void* pv, uint32_t dwDestContext, void* pvDes..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_marshaler;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nnamespace winrt::impl\n{\n#if defined(_MSC_VER)\n#pragma warning(push)\n#pragma warning(disable:4458) // declaration hides class member (okay because we do not use named members of base class)\n#endif\n\n    template <typename T, typename H>\n    struct implements_delegate : abi_t<T>, H, update_module_lock\n    {\n        implements_delegate(H&& handler) : H(std::forward<H>(handler))\n        {\n        }\n\n        int32_t __stdcall QueryInterface(guid const& id, void** result) noexcept final\n        {\n            if (is_guid_of<T>(id) || is_guid_of<Windows::Foundation::IUnknown>(id) || is_guid_of<IAgileObject>(id))\n            {\n                *result = static_cast<abi_t<T>*>(this);\n                AddRef();\n                return 0;\n            }\n\n            if (is_guid_of<IMarshal>(id))\n            {\n                return make_marshaler(this, result);\n            }\n\n            *result = nullptr;\n            return error_no_interface;\n        }\n\n        uint32_t __stdcall AddRef() noexcept final\n        {\n            return ++m_references;\n        }\n\n        uint32_t __stdcall Release() noexcept final\n        {\n            auto const remaining = --m_references;\n\n            if (remaining == 0)\n            {\n                delete static_cast<delegate<T, H>*>(this);\n            }\n\n            return remaining;\n        }\n\n    private:\n\n        atomic_ref_count m_references{ 1 };\n    };\n\n    template <typename T, typename H>\n    T make_delegate(H&& handler)\n    {\n        return { static_cast<void*>(static_cast<abi_t<T>*>(new delegate<T, H>(std::forward<H>(handler)))), take_ownership_from_abi };\n    }\n\n    template <typename T>\n    T make_agile_delegate(T const& delegate) noexcept\n    {\n        if constexpr (!has_category_v<T>)\n        {\n            return delegate;\n        }\n        else\n        {\n            if (delegate.template try_as<IAgileObject>())\n            {\n                return delegate;\n            }\n\n            com_ptr<IAgileReference> ref;\n            get_agile_reference(guid_of<T>(), get_abi(delegate), r..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_delegate;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n    struct event_token\n    {\n        int64_t value{};\n\n        explicit operator bool() const noexcept\n        {\n            return value != 0;\n        }\n    };\n\n    inline bool operator==(event_token const& left, event_token const& right) noexcept\n    {\n        return left.value == right.value;\n    }\n\n    struct auto_revoke_t {};\n    inline constexpr auto_revoke_t auto_revoke{};\n\n    template <typename I>\n    struct event_revoker\n    {\n        using method_type = int32_t(__stdcall impl::abi_t<I>::*)(winrt::event_token);\n\n        event_revoker() noexcept = default;\n        event_revoker(event_revoker const&) = delete;\n        event_revoker& operator=(event_revoker const&) = delete;\n        event_revoker(event_revoker&&) noexcept = default;\n\n        event_revoker& operator=(event_revoker&& other) noexcept\n        {\n            if (this != &other)\n            {\n                revoke();\n                m_object = std::move(other.m_object);\n                m_method = other.m_method;\n                m_token = other.m_token;\n            }\n\n            return *this;\n        }\n\n        template <typename U>\n        event_revoker(U&& object, method_type method, event_token token) :\n            m_object(std::forward<U>(object)),\n            m_method(method),\n            m_token(token)\n        {}\n\n        ~event_revoker() noexcept\n        {\n            revoke();\n        }\n\n        void revoke() noexcept\n        {\n            if (I object = std::exchange(m_object, {}).get())\n            {\n                ((*reinterpret_cast<impl::abi_t<I>**>(&object))->*(m_method))(m_token);\n            }\n        }\n\n        explicit operator bool() const noexcept\n        {\n            return m_object ? true : false;\n        }\n\n    private:\n\n        weak_ref<I> m_object;\n        method_type m_method{};\n        event_token m_token{};\n    };\n\n    template <typename I>\n    struct factory_event_revoker\n    {\n        using method_type = int32_t(__stdcall impl::abi_t<I>::*)(winrt::event_token);\n\n        factory_even..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_events;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nnamespace winrt::impl\n{\n    struct library_traits\n    {\n        using type = void*;\n\n        static void close(type value) noexcept\n        {\n            WINRT_IMPL_FreeLibrary(value);\n        }\n\n        static constexpr type invalid() noexcept\n        {\n            return nullptr;\n        }\n    };\n\n    using library_handle = handle_type<library_traits>;\n\n    inline int32_t __stdcall fallback_RoGetActivationFactory(void*, guid const&, void** factory) noexcept\n    {\n        *factory = nullptr;\n        return error_class_not_available;\n    }\n\n\n    template <bool isSameInterfaceAsIActivationFactory>\n    WINRT_IMPL_NOINLINE hresult get_runtime_activation_factory_impl(param::hstring const& name, winrt::guid const& guid, void** result) noexcept\n    {\n        if (winrt_activation_handler)\n        {\n            return winrt_activation_handler(*(void**)(&name), guid, result);\n        }\n\n        static int32_t(__stdcall * handler)(void* classId, winrt::guid const& iid, void** factory) noexcept;\n        impl::load_runtime_function(L\"combase.dll\", \"RoGetActivationFactory\", handler, fallback_RoGetActivationFactory);\n        hresult hr = handler(*(void**)(&name), guid, result);\n\n        if (hr == impl::error_not_initialized)\n        {\n            auto usage = reinterpret_cast<int32_t(__stdcall*)(void** cookie) noexcept>(WINRT_IMPL_GetProcAddress(WINRT_IMPL_LoadLibraryW(L\"combase.dll\"), \"CoIncrementMTAUsage\"));\n\n            if (!usage)\n            {\n                return hr;\n            }\n\n            void* cookie;\n            usage(&cookie);\n            hr = handler(*(void**)(&name), guid, result);\n        }\n\n        if (hr == 0)\n        {\n            return 0;\n        }\n\n        com_ptr<IErrorInfo> error_info;\n        WINRT_IMPL_GetErrorInfo(0, error_info.put_void());\n\n        std::wstring path{ static_cast<hstring const&>(name) };\n        std::size_t count{};\n\n        while (std::wstring::npos != (count = path.rfind(\'.\')))\n        {\n            path.resize(count);\n            path += L\".dll\";\n            library_handle lib..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_activation;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "#if defined(_MSC_VER)\n#if defined(_DEBUG) && !defined(WINRT_NO_MAKE_DETECTION)\n#pragma detect_mismatch(\"C++/WinRT WINRT_NO_MAKE_DETECTION\", \"make detection enabled (DEBUG and !WINRT_NO_MAKE_DETECTION)\")\n#else\n#pragma detect_mismatch(\"C++/WinRT WINRT_NO_MAKE_DETECTION\", \"make detection disabled (!DEBUG or WINRT_NO_MAKE_DETECTION)\")\n#endif\n#endif\n\nnamespace winrt::impl\n{\n    struct marker\n    {\n        marker() = delete;\n    };\n}\n\nWINRT_EXPORT namespace winrt\n{\n    struct non_agile : impl::marker {};\n    struct no_weak_ref : impl::marker {};\n    struct composing : impl::marker {};\n    struct composable : impl::marker {};\n    struct no_module_lock : impl::marker {};\n    struct static_lifetime : impl::marker {};\n\n    template <typename Interface>\n    struct cloaked : Interface {};\n\n    template <typename D, typename... I>\n    struct implements;\n}\n\nnamespace winrt::impl\n{\n    template<typename...T>\n    using tuple_cat_t = decltype(std::tuple_cat(std::declval<T>()...));\n\n    template <template <typename> typename Condition, typename>\n    struct tuple_if_base;\n\n    template <template <typename> typename Condition, typename...T>\n    struct tuple_if_base<Condition, std::tuple<T...>> { using type = tuple_cat_t<typename std::conditional<Condition<T>::value, std::tuple<T>, std::tuple<>>::type...>; };\n\n    template <template <typename> typename Condition, typename T>\n    using tuple_if = typename tuple_if_base<Condition, T>::type;\n\n    template <typename T>\n    struct is_interface : std::disjunction<std::is_base_of<Windows::Foundation::IInspectable, T>, is_classic_com_interface<T>> {};\n\n    template <typename T>\n    struct is_marker : std::disjunction<std::is_base_of<marker, T>, std::is_void<T>> {};\n\n    template <typename T>\n    struct uncloak_base\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    struct uncloak_base<cloaked<T>>\n    {\n        using type = T;\n    };\n\n    template <typename T>\n    using uncloak = typename uncloak_base<T>::type;\n\n    template <typename I>\n    struct is_cloaked : std::disjuncti..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_implements;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nnamespace winrt::impl\n{\n    template <typename D>\n    struct composable_factory\n    {\n        template <typename I, typename... Args>\n        static I CreateInstance(const Windows::Foundation::IInspectable& outer, Windows::Foundation::IInspectable& inner, Args&&... args)\n        {\n            static_assert(std::is_base_of_v<Windows::Foundation::IInspectable, I>, \"Requested interface must derive from winrt::Windows::Foundation::IInspectable\");\n            inner = CreateInstanceImpl(outer, std::forward<Args>(args)...);\n            return inner.as<I>();\n        }\n\n    private:\n        template <typename... Args>\n        static Windows::Foundation::IInspectable CreateInstanceImpl(const Windows::Foundation::IInspectable& outer, Args&&... args)\n        {\n            // Very specific dance here. The return value must have a ref on the outer, while inner must have a ref count of 1.\n            // Be sure not to make a delegating QueryInterface call because the controlling outer is not fully constructed yet.\n            com_ptr<D> instance = make_self<D>(std::forward<Args>(args)...);\n            instance->m_outer = static_cast<inspectable_abi*>(get_abi(outer));\n            Windows::Foundation::IInspectable inner;\n            attach_abi(inner, to_abi<INonDelegatingInspectable>(detach_abi(instance)));\n            return inner;\n        }\n    };\n\n    template <typename T, typename D, typename I>\n    class WINRT_IMPL_EMPTY_BASES produce_dispatch_to_overridable_base\n    {\n    protected:\n        D& shim() noexcept\n        {\n            return static_cast<T&>(*this).instance;\n        }\n\n        I shim_overridable()\n        {\n            void* result{};\n\n            if (shim().outer())\n            {\n                check_hresult(shim().QueryInterface(guid_of<I>(), &result));\n            }\n\n            return { result, take_ownership_from_abi };\n        }\n    };\n\n    template <typename T, typename D, typename I>\n    struct produce_dispatch_to_overridable;\n\n    template <typename D, typename... I>\n    class dispatch_to_overridable\n..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_composable;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt::Windows::Foundation\n{\n    struct Point\n    {\n        float X;\n        float Y;\n\n        Point() noexcept = default;\n\n        constexpr Point(float X, float Y) noexcept\n            : X(X), Y(Y)\n        {}\n\n#ifdef WINRT_IMPL_NUMERICS\n\n        constexpr Point(Numerics::float2 const& value) noexcept\n            : X(value.x), Y(value.y)\n        {}\n\n        operator Numerics::float2() const noexcept\n        {\n            return { X, Y };\n        }\n\n#endif\n    };\n\n    constexpr bool operator==(Point const& left, Point const& right) noexcept\n    {\n        return left.X == right.X && left.Y == right.Y;\n    }\n\n    constexpr bool operator!=(Point const& left, Point const& right) noexcept\n    {\n        return !(left == right);\n    }\n\n    struct Size\n    {\n        float Width;\n        float Height;\n\n        Size() noexcept = default;\n\n        constexpr Size(float Width, float Height) noexcept\n            : Width(Width), Height(Height)\n        {}\n\n#ifdef WINRT_IMPL_NUMERICS\n\n        constexpr Size(Numerics::float2 const& value) noexcept\n            : Width(value.x), Height(value.y)\n        {}\n\n        operator Numerics::float2() const noexcept\n        {\n            return { Width, Height };\n        }\n\n#endif\n    };\n\n    constexpr bool operator==(Size const& left, Size const& right) noexcept\n    {\n        return left.Width == right.Width && left.Height == right.Height;\n    }\n\n    constexpr bool operator!=(Size const& left, Size const& right) noexcept\n    {\n        return !(left == right);\n    }\n\n    struct Rect\n    {\n        float X;\n        float Y;\n        float Width;\n        float Height;\n\n        Rect() noexcept = default;\n\n        constexpr Rect(float X, float Y, float Width, float Height) noexcept :\n            X(X), Y(Y), Width(Width), Height(Height)\n        {}\n\n        constexpr Rect(Point const& point, Size const& size)  noexcept :\n            X(point.X), Y(point.Y), Width(size.Width), Height(size.Height)\n        {}\n    };\n\n    constexpr bool operator==(Rect const& left, Rect const& righ..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_foundation;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n    struct file_time\n    {\n        uint64_t value{};\n\n        file_time() noexcept = default;\n\n        constexpr explicit file_time(uint64_t const value) noexcept : value(value)\n        {\n        }\n\n#ifdef _FILETIME_\n        constexpr file_time(FILETIME const& value) noexcept\n            : value(value.dwLowDateTime | (static_cast<uint64_t>(value.dwHighDateTime) << 32))\n        {\n        }\n\n        operator FILETIME() const noexcept\n        {\n            return { static_cast<DWORD>(value & 0xFFFFFFFF), static_cast<DWORD>(value >> 32) };\n        }\n#endif\n    };\n\n    struct clock\n    {\n        using rep = int64_t;\n        using period = impl::filetime_period;\n        using duration = Windows::Foundation::TimeSpan;\n        using time_point = Windows::Foundation::DateTime;\n\n        static constexpr bool is_steady = false;\n\n        static time_point now() noexcept\n        {\n            file_time ft;\n            WINRT_IMPL_GetSystemTimePreciseAsFileTime(&ft);\n            return from_file_time(ft);\n        }\n\n        static time_t to_time_t(time_point const& time) noexcept\n        {\n            return static_cast<time_t>(std::chrono::system_clock::to_time_t(std::chrono::time_point_cast<std::chrono::system_clock::duration>(to_sys(time))));\n        }\n\n        static time_point from_time_t(time_t time) noexcept\n        {\n            return from_sys(std::chrono::time_point_cast<duration>(std::chrono::system_clock::from_time_t(time)));\n        }\n\n        static file_time to_file_time(time_point const& time) noexcept\n        {\n            return file_time{ static_cast<uint64_t>(time.time_since_epoch().count()) };\n        }\n\n        static time_point from_file_time(file_time const& time) noexcept\n        {\n            return time_point{ duration{ time.value } };\n        }\n\n        static auto to_FILETIME(time_point const& time) noexcept\n        {\n            return to_file_time(time);\n        }\n\n        static time_point from_FILETIME(file_time const& time) noexcept\n        {\n            return f..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_chrono;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nWINRT_EXPORT namespace winrt\n{\n    struct access_token : handle\n    {\n        static access_token process()\n        {\n            access_token token;\n            check_bool(WINRT_IMPL_OpenProcessToken(WINRT_IMPL_GetCurrentProcess(), 0x0002 /*TOKEN_DUPLICATE*/, token.put()));\n            access_token duplicate;\n            check_bool(WINRT_IMPL_DuplicateToken(token.get(), 2 /*SecurityImpersonation*/, duplicate.put()));\n            return duplicate;\n        }\n\n        static access_token thread()\n        {\n            access_token token;\n\n            if (!WINRT_IMPL_OpenThreadToken(WINRT_IMPL_GetCurrentThread(), 0x0004 /*TOKEN_IMPERSONATE*/, 1, token.put()))\n            {\n                uint32_t const error = WINRT_IMPL_GetLastError();\n\n                if (error != 1008 /*ERROR_NO_TOKEN*/)\n                {\n                    throw_hresult(impl::hresult_from_win32(error));\n                }\n            }\n\n            return token;\n        }\n\n        static access_token client()\n        {\n            struct impersonate_guard\n            {\n                impersonate_guard(com_ptr<impl::IServerSecurity> const& server) : m_server(server)\n                {\n                    check_hresult(m_server->ImpersonateClient());\n                }\n\n                ~impersonate_guard()\n                {\n                    check_hresult(m_server->RevertToSelf());\n                }\n\n            private:\n\n                com_ptr<impl::IServerSecurity> const& m_server;\n            };\n\n            auto server = capture<impl::IServerSecurity>(WINRT_IMPL_CoGetCallContext);\n            impersonate_guard impersonate(server);\n            return thread();\n        }\n\n        access_token() = default;\n        access_token(access_token&& other) = default;\n        access_token& operator=(access_token&& other) = default;\n\n        access_token impersonate() const\n        {\n            auto previous = thread();\n            check_bool(WINRT_IMPL_SetThreadToken(nullptr, get()));\n            return previous;\n        }\n\n        void revert() cons..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_security;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nnamespace winrt::impl\n{\n    inline size_t hash_data(void const* ptr, size_t const bytes) noexcept\n    {\n#ifdef _WIN64\n        constexpr size_t fnv_offset_basis = 14695981039346656037ULL;\n        constexpr size_t fnv_prime = 1099511628211ULL;\n#else\n        constexpr size_t fnv_offset_basis = 2166136261U;\n        constexpr size_t fnv_prime = 16777619U;\n#endif\n        size_t result = fnv_offset_basis;\n        uint8_t const* const buffer = static_cast<uint8_t const*>(ptr);\n\n        for (size_t next = 0; next < bytes; ++next)\n        {\n            result ^= buffer[next];\n            result *= fnv_prime;\n        }\n\n        return result;\n    }\n\n    struct hash_base\n    {\n        size_t operator()(Windows::Foundation::IUnknown const& value) const noexcept\n        {\n            void* const abi_value = get_abi(value.try_as<Windows::Foundation::IUnknown>());\n            return std::hash<void*>{}(abi_value);\n        }\n    };\n}\n\nnamespace std\n{\n    template<> struct hash<winrt::hstring>\n    {\n        size_t operator()(winrt::hstring const& value) const noexcept\n        {\n            return std::hash<std::wstring_view>{}(value);\n        }\n    };\n\n    template<> struct hash<winrt::Windows::Foundation::IUnknown> : winrt::impl::hash_base {};\n    template<> struct hash<winrt::Windows::Foundation::IInspectable> : winrt::impl::hash_base {};\n    template<> struct hash<winrt::Windows::Foundation::IActivationFactory> : winrt::impl::hash_base {};\n    \n    template<> struct hash<winrt::guid>\n    {\n        size_t operator()(winrt::guid const& value) const noexcept\n        {\n            return winrt::impl::hash_data(&value, sizeof(value));\n        }\n    };\n}\n"
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_std_hash;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nnamespace winrt::impl\n{\n    template <typename T>\n    struct fast_iterator\n    {\n        using iterator_concept = std::random_access_iterator_tag;\n        using iterator_category = std::input_iterator_tag;\n        using value_type = decltype(std::declval<T>().GetAt(0));\n        using difference_type = ptrdiff_t;\n        using pointer = void;\n        using reference = value_type;\n\n        fast_iterator() noexcept = default;\n\n        fast_iterator(T const& collection, uint32_t const index) noexcept :\n            m_collection(&collection),\n            m_index(index)\n        {}\n\n        fast_iterator& operator++() noexcept\n        {\n            ++m_index;\n            return *this;\n        }\n\n        fast_iterator operator++(int) noexcept\n        {\n            auto previous = *this;\n            ++m_index;\n            return previous;\n        }\n\n        fast_iterator& operator--() noexcept\n        {\n            --m_index;\n            return *this;\n        }\n\n        fast_iterator operator--(int) noexcept\n        {\n            auto previous = *this;\n            --m_index;\n            return previous;\n        }\n\n        fast_iterator& operator+=(difference_type n) noexcept\n        {\n            m_index += static_cast<uint32_t>(n);\n            return *this;\n        }\n\n        fast_iterator operator+(difference_type n) const noexcept\n        {\n            return fast_iterator(*this) += n;\n        }\n\n        fast_iterator& operator-=(difference_type n) noexcept\n        {\n            return *this += -n;\n        }\n\n        fast_iterator operator-(difference_type n) const noexcept\n        {\n            return *this + -n;\n        }\n\n        difference_type operator-(fast_iterator const& other) const noexcept\n        {\n            WINRT_ASSERT(m_collection == other.m_collection);\n            return static_cast<difference_type>(m_index) - static_cast<difference_type>(other.m_index);\n        }\n\n        reference operator*() const\n        {\n            return m_collection->GetAt(m_index);\n        }\n\n        reference operator[](di..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_iterator;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\nnamespace winrt::impl\n{\n    inline auto submit_threadpool_callback(void(__stdcall* callback)(void*, void* context), void* context)\n    {\n        if (!WINRT_IMPL_TrySubmitThreadpoolCallback(callback, context, nullptr))\n        {\n            throw_last_error();\n        }\n    }\n\n    inline void __stdcall resume_background_callback(void*, void* context) noexcept\n    {\n        coroutine_handle<>::from_address(context)();\n    };\n\n    inline auto resume_background(coroutine_handle<> handle)\n    {\n        submit_threadpool_callback(resume_background_callback, handle.address());\n    }\n\n    inline std::pair<int32_t, int32_t> get_apartment_type() noexcept\n    {\n        int32_t aptType;\n        int32_t aptTypeQualifier;\n        if (0 == WINRT_IMPL_CoGetApartmentType(&aptType, &aptTypeQualifier))\n        {\n            return { aptType, aptTypeQualifier };\n        }\n        else\n        {\n            return { 1 /* APTTYPE_MTA */, 1 /* APTTYPEQUALIFIER_IMPLICIT_MTA */ };\n        }\n    }\n\n    inline bool is_sta_thread() noexcept\n    {\n        auto type = get_apartment_type();\n        switch (type.first)\n        {\n        case 0: /* APTTYPE_STA */\n        case 3: /* APTTYPE_MAINSTA */\n            return true;\n        case 2: /* APTTYPE_NA */\n            return type.second == 3 /* APTTYPEQUALIFIER_NA_ON_STA */ ||\n                type.second == 5 /* APTTYPEQUALIFIER_NA_ON_MAINSTA */;\n        }\n        return false;\n    }\n\n    struct resume_apartment_context\n    {\n        resume_apartment_context() = default;\n        resume_apartment_context(std::nullptr_t) : m_context(nullptr), m_context_type(-1) {}\n        resume_apartment_context(resume_apartment_context const&) = default;\n        resume_apartment_context(resume_apartment_context&& other) noexcept :\n            m_context(std::move(other.m_context)), m_context_type(std::exchange(other.m_context_type, -1)) {}\n        resume_apartment_context& operator=(resume_apartment_context const&) = default;\n        resume_apartment_context& operator=(resume_apartment_context&& other) noexcept..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_coroutine_threadpool
          ;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\n#if defined(_DEBUG) && !defined(WINRT_NATVIS)\n#define WINRT_NATVIS\n#endif\n\n#ifdef WINRT_NATVIS\n\nnamespace winrt::impl\n{\n    struct natvis\n    {\n        static auto __stdcall abi_val(void* object, wchar_t const * iid_str, int method)\n        {\n            union variant\n            {\n                bool b;\n                wchar_t c;\n                int8_t i1;\n                int16_t i2;\n                int32_t i4;\n                int64_t i8;\n                uint8_t u1;\n                uint16_t u2;\n                uint32_t u4;\n                uint64_t u8;\n                float r4;\n                double r8;\n                guid g;\n                void* s;\n                uint8_t v[1024];\n            }\n            value;\n            value.s = 0;\n            guid iid;\n            if (WINRT_IMPL_IIDFromString(iid_str, &iid) == 0)\n            {\n                struct memory_basic_information\n                {\n                    void* base_address;\n                    void* allocation_base;\n                    uint32_t allocation_protect;\n#ifdef _WIN64\n                    uint32_t __alignment1;\n#endif\n                    uintptr_t region_size;\n                    uint32_t state;\n                    uint32_t protect;\n                    uint32_t type;\n#ifdef _WIN64\n                    uint32_t __alignment2;\n#endif\n                };\n                memory_basic_information info;\n                // validate object pointer is readable\n                if ((WINRT_IMPL_VirtualQuery(object, &info, sizeof(info)) != 0) && ((info.protect & 0xEE) != 0))\n                {\n                    inspectable_abi* pinsp;\n                    if (((unknown_abi*)object)->QueryInterface(iid, reinterpret_cast<void**>(&pinsp)) == 0)\n                    {\n                        static const int IInspectable_vtbl_size = 6;\n                        auto vtbl = *(void***)pinsp;\n                        // validate vtbl pointer is readable\n                        if ((WINRT_IMPL_VirtualQuery(vtbl, &info, sizeof(info)) != 0) && ((info.protect & 0xE..." /* TRUNCATED STRING LITERAL */
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_natvis;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          output_folder._M_pathname._M_dataplus._M_p =
               (pointer)strlen(
                              "\n// WINRT_version is used by Microsoft to analyze C++/WinRT library adoption and inform future product decisions.\nextern \"C\"\n__declspec(selectany)\nchar const * const WINRT_version = \"C++/WinRT version:\" CPPWINRT_VERSION;\n\n#if defined(_MSC_VER)\n#ifdef _M_IX86\n#pragma comment(linker, \"/include:_WINRT_version\")\n#else\n#pragma comment(linker, \"/include:WINRT_version\")\n#endif\n\n#pragma detect_mismatch(\"C++/WinRT version\", CPPWINRT_VERSION)\n#endif\n\nWINRT_EXPORT namespace winrt\n{\n    template <size_t BaseSize, size_t ComponentSize>\n    constexpr bool check_version(char const(&base)[BaseSize], char const(&component)[ComponentSize]) noexcept\n    {\n        if constexpr (BaseSize != ComponentSize)\n        {\n            return false;\n        }\n\n        for (size_t i = 0; i != BaseSize - 1; ++i)\n        {\n            if (base[i] != component[i])\n            {\n                return false;\n            }\n        }\n\n        return true;\n    }\n}\n"
                              );
          output_folder._M_pathname._M_string_length = (size_type)strings::base_version;
          writer_base<cppwinrt::writer>::write_impl
                    ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder);
          finish_with::~finish_with((finish_with *)&license_arg);
          std::operator+(&output_folder._M_pathname,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (settings + 0x60),"winrt/base.h");
          ppVar24 = &output_folder;
          writer_base<cppwinrt::writer>::flush_to_file
                    ((writer_base<cppwinrt::writer> *)&template_file,&ppVar24->_M_pathname);
          std::__cxx11::string::~string((string *)&output_folder);
          writer::~writer((writer *)&template_file,(UI *)ppVar24,uis_00);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &template_file,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (settings + 0x60),"winrt/winrt.ixx");
          filename = (method_signature *)&template_file;
          writer_base<cppwinrt::writer>::flush_to_file
                    (&ixx.super_writer_base<cppwinrt::writer>,(string *)filename);
          std::__cxx11::string::~string((string *)&template_file);
          pUVar37 = extraout_RDX_00;
        }
        auVar46._8_8_ = pUVar37;
        auVar46._0_8_ = c.m_namespaces._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (settings[0xaa] == '\x01') {
          classes.
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          classes.
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          classes.
          super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          while( true ) {
            p_Var26 = auVar46._0_8_;
            if ((_Rb_tree_header *)p_Var26 == &c.m_namespaces._M_t._M_impl.super__Rb_tree_header)
            break;
            pmVar7 = *(method_signature **)(p_Var26 + 4);
            for (pmVar32 = (method_signature *)p_Var26[3]._M_right; pmVar32 != pmVar7;
                pmVar32 = (method_signature *)&pmVar32->m_signature) {
              filename = pmVar32;
              bVar15 = winmd::reader::filter::includes
                                 ((filter *)(settings + 0x1b8),(TypeDef *)pmVar32);
              if (bVar15) {
                filename = pmVar32;
                std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
                push_back(&classes,(value_type *)pmVar32);
              }
            }
            auVar46 = std::_Rb_tree_increment(p_Var26);
          }
          if (classes.
              super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              classes.
              super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            writer::writer((writer *)&template_file,(UI *)filename,auVar46._8_8_);
            write_preamble((writer *)&template_file);
            output_folder._M_pathname._M_dataplus._M_p = (pointer)0xc;
            output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_a24bf;
            write_open_file_guard((writer *)&template_file,(string_view *)&output_folder,'\0');
            license_arg._M_string_length = (size_type)write_close_file_guard;
            license_arg._M_dataplus._M_p = (pointer)&template_file;
            sVar31 = get_fastabi_size((writer *)&template_file,&classes);
            fast_abi_size = sVar31;
            output_folder._M_pathname._M_dataplus._M_p =
                 (pointer)strlen(
                                "#include <cstddef>\n#include <atomic>\n\n#define WINRT_IMPL_STRING_1(expression) #expression\n#define WINRT_IMPL_STRING(expression) WINRT_IMPL_STRING_1(expression)\n\n#if defined(_MSC_VER)\n#define WINRT_IMPL_FF_NOVTABLE __declspec(novtable)\n#else\n#define WINRT_IMPL_FF_NOVTABLE\n#endif\n\n#if !defined(WINRT_FAST_ABI_SIZE)\n#define WINRT_FAST_ABI_SIZE %\n#endif\n\nstatic_assert(WINRT_FAST_ABI_SIZE >= %);\n\n#pragma detect_mismatch(\"WINRT_FAST_ABI_SIZE\", WINRT_IMPL_STRING(WINRT_FAST_ABI_SIZE))\n\nnamespace winrt::impl\n{\n    // Thunk definitions are in arch-specific assembly sources\n%\n    struct fast_abi_forwarder\n    {\n        struct guid\n        {\n            uint32_t Data1;\n            uint16_t Data2;\n            uint16_t Data3;\n            uint8_t  Data4[8];\n            inline bool operator!=(guid const& right) const noexcept\n            {\n                return memcmp(this, &right, sizeof(guid));\n            }\n        };\n\n        struct WINRT_IMPL_FF_NOVTABLE inspectable\n        {\n            virtual int32_t __stdcall QueryInterface(guid const& id, void** object) noexcept = 0;\n            virtual uint32_t __stdcall AddRef() noexcept = 0;\n            virtual uint32_t __stdcall Release() noexcept = 0;\n            virtual int32_t __stdcall GetIids(uint32_t* count, guid** ids) noexcept = 0;\n            virtual int32_t __stdcall GetRuntimeClassName(void** name) noexcept = 0;\n            virtual int32_t __stdcall GetTrustLevel(uint32_t* level) noexcept = 0;\n        };\n\n        void* const* m_vfptr;\n        inspectable* m_owner;\n        std::size_t m_offset;\n        guid m_iid;\n        std::atomic<uint32_t> m_references{ 1 };\n\n        fast_abi_forwarder(void* owner, guid const& iid, std::size_t offset) noexcept :\n            m_vfptr(s_vtable), m_owner(static_cast<inspectable*>(owner)), m_iid(iid), m_offset(offset)\n        {\n            m_owner->AddRef();\n        }\n\n        ~fast_abi_forwarder() noexcept\n        {\n            m_owner->Release();\n        }\n\n        static int32_t __stdcall QueryInterface(fast_abi_forwarder* self, guid co..." /* TRUNCATED STRING LITERAL */
                                );
            output_folder._M_pathname._M_string_length = (size_type)strings::base_fast_forward;
            writer_base<cppwinrt::writer>::
            write_segment<unsigned_long,_unsigned_long,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                      ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder
                       ,&fast_abi_size,&fast_abi_size,(anon_class_1_0_00000001 *)in_R8,in_R9);
            finish_with::~finish_with((finish_with *)&license_arg);
            std::operator+(&output_folder._M_pathname,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (settings + 0x60),"winrt/fast_forward.h");
            ppVar24 = &output_folder;
            writer_base<cppwinrt::writer>::flush_to_file
                      ((writer_base<cppwinrt::writer> *)&template_file,&ppVar24->_M_pathname);
            std::__cxx11::string::~string((string *)&output_folder);
            writer::~writer((writer *)&template_file,(UI *)ppVar24,uis_01);
            writer::writer((writer *)&template_file,(UI *)ppVar24,uis_02);
            write_preamble((writer *)&template_file);
            write_pch((writer *)&template_file);
            output_folder._M_pathname._M_dataplus._M_p = (pointer)0x4;
            output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_9d4e0;
            writer::write_root_include((writer *)&template_file,(string_view *)&output_folder);
            output_folder._M_pathname._M_dataplus._M_p = (pointer)0x1dc;
            output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_a255a;
            fast_abi_size = (size_t)&classes;
            license_arg._M_dataplus._M_p = (pointer)&classes;
            writer_base<cppwinrt::writer>::
            write_segment<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:446:16),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:446:16)>
                      ((writer_base<cppwinrt::writer> *)&template_file,(string_view *)&output_folder
                       ,(anon_class_8_1_898e5d9c *)&license_arg,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &fast_abi_size,in_R8,(anon_class_8_1_898e5d9c *)in_R9);
            bVar15 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(settings + 0x118),"winrt");
            if (!bVar15) {
              output_folder._M_pathname._M_dataplus._M_p = (pointer)0x33f;
              output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_a2575;
              writer_base<cppwinrt::writer>::
              write_segment<std::__cxx11::string,std::__cxx11::string>
                        ((writer_base<cppwinrt::writer> *)&template_file,
                         (string_view *)&output_folder,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (settings + 0x118),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (settings + 0x118));
            }
            std::operator+(&output_folder._M_pathname,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (settings + 0x60),"module.g.cpp");
            filename = (method_signature *)&output_folder;
            writer_base<cppwinrt::writer>::flush_to_file
                      ((writer_base<cppwinrt::writer> *)&template_file,(string *)&output_folder);
            std::__cxx11::string::~string((string *)&output_folder);
            writer::~writer((writer *)&template_file,(UI *)filename,uis_03);
            pTVar14 = classes.
                      super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            pmVar32 = (method_signature *)
                      classes.
                      super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar24 = (path *)classes.
                              super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
            pUVar37 = extraout_RDX_01;
            while( true ) {
              if (pmVar32 == (method_signature *)pTVar14) break;
              writer::writer((writer *)&template_file,(UI *)filename,pUVar37);
              writer::add_depends((writer *)&template_file,(TypeDef *)pmVar32);
              type_name = winmd::reader::TypeDef::TypeName((TypeDef *)pmVar32);
              type_namespace = winmd::reader::TypeDef::TypeNamespace((TypeDef *)pmVar32);
              get_factories_abi_cxx11_
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                          *)&output_folder,(cppwinrt *)&template_file,(writer *)pmVar32,
                         (TypeDef *)ppVar24);
              winmd::reader::TypeDef::InterfaceImpl
                        ((pair<winmd::reader::InterfaceImpl,_winmd::reader::InterfaceImpl> *)
                         &license_arg,(TypeDef *)pmVar32);
              bVar15 = license_arg._M_dataplus._M_p !=
                       (pointer)CONCAT71(license_arg.field_2._M_allocated_capacity._1_7_,
                                         license_arg.field_2._M_local_buf[0]);
              ppVar24 = (path *)(ulong)(uint)license_arg.field_2._8_4_;
              bVar42 = (int)license_arg._M_string_length != license_arg.field_2._8_4_;
              if (bVar42 || bVar15) {
                TVar43 = get_base_class((TypeDef *)pmVar32);
                local_5e8._0_8_ = TVar43.super_row_base<winmd::reader::TypeDef>.m_table;
                license_arg._M_dataplus._M_p = (pointer)&license_arg.field_2;
                license_arg._M_string_length = 0;
                local_5e8._8_4_ = TVar43.super_row_base<winmd::reader::TypeDef>.m_index;
                license_arg.field_2._M_local_buf[0] = '\0';
                _Stack_670._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                fast_abi_size = (size_t)&local_668;
                local_668._M_local_buf[0] = '\0';
                base_type_argument._M_dataplus._M_p = (pointer)&base_type_argument.field_2;
                base_type_argument._M_string_length = 0;
                local_500 = 0;
                ___a2_1 = &local_4f8;
                external_requires._M_string_length = 0;
                external_requires._M_dataplus._M_p = (pointer)&external_requires.field_2;
                base_type_argument.field_2._M_local_buf[0] = '\0';
                local_4f8._M_local_buf[0] = '\0';
                external_requires.field_2._M_local_buf[0] = '\0';
                if ((method_signature *)local_5e8._0_8_ != (method_signature *)0x0) {
                  bVar17 = winmd::reader::filter::includes
                                     ((filter *)(settings + 0x1b8),(TypeDef *)local_5e8);
                  if (bVar17) {
                    local_628._M_len = 0x1a;
                    local_628._M_str = "using composable_base = B;";
                    writer_base<cppwinrt::writer>::write_temp<>
                              ((string *)&base_interfaces,
                               (writer_base<cppwinrt::writer> *)&template_file,&local_628);
                    std::__cxx11::string::operator=
                              ((string *)&license_arg,(string *)&base_interfaces);
                    std::__cxx11::string::~string((string *)&base_interfaces);
                    std::__cxx11::string::assign((char *)&fast_abi_size);
                    std::__cxx11::string::assign((char *)&base_type_argument);
                    std::__cxx11::string::assign((char *)&__a2_1);
                  }
                  else {
                    local_628._M_len = 0x1a;
                    local_628._M_str = "using composable_base = %;";
                    type_00 = (writer *)local_5e8;
                    writer_base<cppwinrt::writer>::write_temp<winmd::reader::TypeDef>
                              ((string *)&base_interfaces,
                               (writer_base<cppwinrt::writer> *)&template_file,&local_628,
                               (TypeDef *)local_5e8);
                    std::__cxx11::string::operator=
                              ((string *)&license_arg,(string *)&base_interfaces);
                    std::__cxx11::string::~string((string *)&base_interfaces);
                    get_interfaces_abi_cxx11_
                              (&base_interfaces,(cppwinrt *)&template_file,(writer *)local_5e8,
                               (TypeDef *)type_00);
                    std::__cxx11::string::assign((char *)&external_requires);
                    ppVar12 = base_interfaces.
                              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    iVar35 = 0;
                    ppVar8 = base_interfaces.
                             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    while (type_07 = &ppVar8->second,
                          (pointer)((long)(type_07 + -1) + 0x18) != ppVar12) {
                      if ((type_07->overridable == false) &&
                         (bVar17 = is_always_disabled(&type_07->type), !bVar17)) {
                        std::__cxx11::string::append((char *)&external_requires);
                        std::__cxx11::string::append((string *)&external_requires);
                        iVar35 = iVar35 + 1;
                      }
                      ppVar8 = (pointer)(type_07 + 1);
                    }
                    if (iVar35 == 0) {
                      external_requires._M_string_length = 0;
                      *external_requires._M_dataplus._M_p = '\0';
                    }
                    else {
                      std::__cxx11::string::push_back((char)&external_requires);
                    }
                    std::
                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                    ::~vector(&base_interfaces);
                  }
                }
                base_interfaces.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)
                     "namespace winrt::@::implementation\n{\n    template <typename D%, typename... I>\n    struct WINRT_IMPL_EMPTY_BASES %_base : implements<D, @::%%%, %I...>%%%\n    {\n        using base_type = %_base;\n        using class_type = @::%;\n        using implements_type = typename %_base::implements_type;\n        using implements_type::implements_type;\n        %\n        hstring GetRuntimeClassName() const\n        {\n            return L\"%.%\";\n        }\n%%%%    };\n}\n"
                ;
                base_interfaces.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1c7;
                local_679 = _Stack_670._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_628._M_str = &local_679;
                in_R8 = (string *)&type_name;
                ppVar24 = (path *)&fast_abi_size;
                local_628._M_len = (size_t)pmVar32;
                local_5d8._0_8_ = pmVar32;
                local_440.args = pmVar32;
                local_f0.args = (TypeDef *)pmVar32;
                local_e8.args = (TypeDef *)pmVar32;
                local_e0.args = (TypeDef *)pmVar32;
                local_d8.args = (TypeDef *)pmVar32;
                writer_base<cppwinrt::writer>::
                write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                          ((writer_base<cppwinrt::writer> *)&template_file,
                           (string_view *)&base_interfaces,&type_namespace,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &fast_abi_size,(basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                           &type_namespace,(basic_string_view<char,_std::char_traits<char>_> *)in_R8
                           ,(anon_class_8_1_89897ddb *)local_5d8,&base_type_argument,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &__a2_1,&external_requires,(anon_class_8_1_89897ddb *)&local_440,
                           &local_d8,(basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                           &type_namespace,(basic_string_view<char,_std::char_traits<char>_> *)in_R8
                           ,(basic_string_view<char,_std::char_traits<char>_> *)in_R8,&license_arg,
                           &type_namespace,(basic_string_view<char,_std::char_traits<char>_> *)in_R8
                           ,&local_e0,&local_e8,&local_f0,(anon_class_16_2_3ed68039 *)&local_628);
                std::__cxx11::string::~string((string *)&external_requires);
                std::__cxx11::string::~string((string *)&__a2_1);
                std::__cxx11::string::~string((string *)&base_type_argument);
                std::__cxx11::string::~string((string *)&fast_abi_size);
                std::__cxx11::string::~string((string *)&license_arg);
              }
              bVar17 = has_factory_members((writer *)&template_file,(TypeDef *)pmVar32);
              if (bVar17) {
                license_arg._M_dataplus._M_p = &DAT_0000015e;
                license_arg._M_string_length = (size_type)anon_var_dwarf_a266e;
                fast_abi_size = (size_t)&output_folder;
                in_R8 = (string *)&fast_abi_size;
                ppVar24 = (path *)&type_name;
                base_type_argument._M_dataplus._M_p = (pointer)&output_folder;
                writer_base<cppwinrt::writer>::
                write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                          ((writer_base<cppwinrt::writer> *)&template_file,
                           (string_view *)&license_arg,&type_namespace,
                           (basic_string_view<char,_std::char_traits<char>_> *)&type_name,
                           (anon_class_8_1_89897ddb_conflict *)in_R8,&type_namespace,
                           (basic_string_view<char,_std::char_traits<char>_> *)&type_name,
                           &type_namespace,
                           (basic_string_view<char,_std::char_traits<char>_> *)&type_name,
                           (anon_class_8_1_89897ddb_conflict *)&base_type_argument);
              }
              if (bVar42 || bVar15) {
                std::__cxx11::string::
                string<std::basic_string_view<char,std::char_traits<char>>,void>
                          ((string *)&license_arg,
                           (basic_string_view<char,_std::char_traits<char>_> *)&type_name,
                           (allocator<char> *)&fast_abi_size);
                sVar10 = license_arg._M_string_length;
                _Var39 = license_arg._M_dataplus;
                pTVar36 = extraout_RDX_02;
                for (sVar41 = 0; sVar10 != sVar41; sVar41 = sVar41 + 1) {
                  iVar35 = toupper((int)_Var39._M_p[sVar41]);
                  _Var39._M_p[sVar41] = (char)iVar35;
                  pTVar36 = extraout_RDX_03;
                }
                get_generated_component_filename_abi_cxx11_
                          ((string *)&fast_abi_size,(cppwinrt *)pmVar32,pTVar36);
                base_type_argument._M_dataplus._M_p = (pointer)0xe3;
                base_type_argument._M_string_length = (size_type)anon_var_dwarf_a268a;
                in_R8 = (string *)&fast_abi_size;
                ppVar24 = (path *)&type_name;
                writer_base<cppwinrt::writer>::
                write_segment<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                          ((writer_base<cppwinrt::writer> *)&template_file,
                           (string_view *)&base_type_argument,&license_arg,(string *)&fast_abi_size,
                           (string *)&fast_abi_size,&type_namespace,
                           (basic_string_view<char,_std::char_traits<char>_> *)&type_name,
                           (basic_string_view<char,_std::char_traits<char>_> *)&type_name);
                std::__cxx11::string::~string((string *)&fast_abi_size);
                std::__cxx11::string::~string((string *)&license_arg);
              }
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                           *)&output_folder);
              writer_base<cppwinrt::writer>::swap((writer_base<cppwinrt::writer> *)&template_file);
              write_preamble((writer *)&template_file);
              write_include_guard((writer *)&template_file);
              auVar47._8_8_ = extraout_RDX_04;
              auVar47._0_8_ = local_3e8._80_8_;
              while( true ) {
                p_Var26 = auVar47._0_8_;
                if (p_Var26 == (_Rb_tree_node_base *)(local_3e8 + 0x40)) break;
                writer::write_depends((writer *)&template_file,(string_view *)(p_Var26 + 1),'\0');
                auVar47 = std::_Rb_tree_increment(p_Var26);
              }
              get_generated_component_filename_abi_cxx11_
                        ((string *)&fast_abi_size,(cppwinrt *)pmVar32,auVar47._8_8_);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &output_folder,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (settings + 0x60),(string *)&fast_abi_size);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &license_arg,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &output_folder,".g.h");
              std::__cxx11::string::~string((string *)&output_folder);
              std::__cxx11::string::~string((string *)&fast_abi_size);
              std::filesystem::__cxx11::path::
              path<std::__cxx11::string,std::filesystem::__cxx11::path>
                        (&output_folder,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &license_arg,auto_format);
              std::filesystem::__cxx11::path::remove_filename();
              std::filesystem::create_directories(&output_folder);
              filename = (method_signature *)&license_arg;
              writer_base<cppwinrt::writer>::flush_to_file
                        ((writer_base<cppwinrt::writer> *)&template_file,&license_arg);
              std::filesystem::__cxx11::path::~path(&output_folder);
              std::__cxx11::string::~string((string *)&license_arg);
              writer::~writer((writer *)&template_file,(UI *)filename,uis_04);
              pUVar37 = uis_05;
              if (settings[0x138] == '\x01') {
                writer::writer((writer *)&output_folder,(UI *)filename,uis_05);
                write_preamble((writer *)&output_folder);
                ___a2_1 = (undefined1  [16])winmd::reader::TypeDef::TypeName((TypeDef *)pmVar32);
                external_requires._0_16_ = winmd::reader::TypeDef::TypeNamespace((TypeDef *)pmVar32)
                ;
                get_impl_name<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                          ((string *)&fast_abi_size,(cppwinrt *)&external_requires,
                           (basic_string_view<char,_std::char_traits<char>_> *)&__a2_1,
                           (basic_string_view<char,_std::char_traits<char>_> *)ppVar24);
                bVar15 = has_factory_members((writer *)&output_folder,(TypeDef *)pmVar32);
                if (bVar15) {
                  _template_file = (pointer)0x6b;
                  cStack_400._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19f24f
                  ;
                  ppVar24 = (path *)&external_requires;
                  in_R8 = (string *)&__a2_1;
                  writer_base<cppwinrt::writer>::
                  write_segment<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                            ((writer_base<cppwinrt::writer> *)&output_folder,
                             (string_view *)&template_file,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &fast_abi_size,
                             (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                             (basic_string_view<char,_std::char_traits<char>_> *)in_R8);
                }
                if (settings[0x138] == '\x01') {
                  wrap_type_namespace((cppwinrt *)&base_interfaces,(writer *)&output_folder,
                                      (string_view *)&external_requires);
                  ppVar48 = (path *)0x10b542;
                  get_factories_abi_cxx11_
                            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                              *)&license_arg,(cppwinrt *)&output_folder,(writer *)pmVar32,
                             (TypeDef *)ppVar24);
                  for (p_Var26 = (_Rb_tree_node_base *)
                                 CONCAT44(license_arg.field_2._12_4_,license_arg.field_2._8_4_);
                      p_Var26 != (_Rb_tree_node_base *)&license_arg._M_string_length;
                      p_Var26 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var26)) {
                    p_Var1 = p_Var26 + 2;
                    if (*(long *)(p_Var26 + 2) == 0) {
LAB_0010b570:
                      if (*(char *)&p_Var26[2]._M_left == '\x01') {
                        if (*(long *)p_Var1 == 0) {
                          _template_file = (pointer)0x41;
                          cStack_400._M_current =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x19f2bb;
                          in_R8 = (string *)&__a2_1;
                          ppVar24 = ppVar48;
                          writer_base<cppwinrt::writer>::
                          write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                                    ((writer_base<cppwinrt::writer> *)&output_folder,
                                     (string_view *)&template_file,
                                     (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                                     (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                                     (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     &external_requires,
                                     (basic_string_view<char,_std::char_traits<char>_> *)in_R8);
                        }
                        else {
                          winmd::reader::TypeDef::MethodList
                                    ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)
                                     &base_type_argument,(TypeDef *)p_Var1);
                          uVar11 = base_type_argument.field_2._8_4_;
                          type_name._M_str = (char *)base_type_argument._M_string_length;
                          type_name._M_len = (size_t)base_type_argument._M_dataplus._M_p;
                          sVar9 = type_name;
                          sVar31 = CONCAT71(base_type_argument.field_2._M_allocated_capacity._1_7_,
                                            base_type_argument.field_2._M_local_buf[0]);
                          type_name._M_str._0_4_ = (int)base_type_argument._M_string_length;
                          iVar35 = (int)type_name._M_str;
                          type_name = sVar9;
                          while ((type_name._M_len != sVar31 || (iVar35 != uVar11))) {
                            method_signature::method_signature
                                      ((method_signature *)&template_file,(MethodDef *)&type_name);
                            type_namespace._M_str =
                                 "    %::%(%) :\n        %(make<@::implementation::%>(%))\n    {\n    }\n"
                            ;
                            type_namespace._M_len = 0x43;
                            ppVar24 = (path *)&__a2_1;
                            in_R8 = (string *)local_5e8;
                            local_628._M_len = (size_t)&template_file;
                            local_5e8._0_8_ = (method_signature *)&template_file;
                            writer_base<cppwinrt::writer>::
                            write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                                      ((writer_base<cppwinrt::writer> *)&output_folder,
                                       &type_namespace,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (anon_class_8_1_89897ddb_conflict1 *)in_R8,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &external_requires,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (anon_class_8_1_89897ddb_conflict1 *)&local_628);
                            method_signature::~method_signature((method_signature *)&template_file);
                            iVar35 = (int)type_name._M_str + 1;
                            type_name._M_str._0_4_ = iVar35;
                          }
                        }
                      }
                      else if ((*(char *)((long)&p_Var26[2]._M_left + 2) == '\x01') &&
                              (*(char *)((long)&p_Var26[2]._M_left + 3) == '\x01')) {
                        winmd::reader::TypeDef::MethodList
                                  ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)
                                   &base_type_argument,(TypeDef *)p_Var1);
                        uVar11 = base_type_argument.field_2._8_4_;
                        type_name._M_str = (char *)base_type_argument._M_string_length;
                        type_name._M_len = (size_t)base_type_argument._M_dataplus._M_p;
                        sVar9 = type_name;
                        sVar31 = CONCAT71(base_type_argument.field_2._M_allocated_capacity._1_7_,
                                          base_type_argument.field_2._M_local_buf[0]);
                        type_name._M_str._0_4_ = (int)base_type_argument._M_string_length;
                        iVar35 = (int)type_name._M_str;
                        type_name = sVar9;
                        while ((type_name._M_len != sVar31 || (iVar35 != uVar11))) {
                          method_signature::method_signature
                                    ((method_signature *)&template_file,(MethodDef *)&type_name);
                          std::
                          vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                          ::resize(local_320,
                                   ((long)local_320[0].
                                          super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_320[0].
                                         super__Vector_base<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0x18 - 2);
                          type_namespace._M_str =
                               "    %::%(%) :\n        %(make<@::implementation::%>(%))\n    {\n    }\n"
                          ;
                          type_namespace._M_len = 0x43;
                          ppVar24 = (path *)&__a2_1;
                          in_R8 = (string *)local_5e8;
                          local_628._M_len = (size_t)&template_file;
                          local_5e8._0_8_ = (method_signature *)&template_file;
                          writer_base<cppwinrt::writer>::
                          write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                                    ((writer_base<cppwinrt::writer> *)&output_folder,&type_namespace
                                     ,(basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                     (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                     (anon_class_8_1_89897ddb_conflict1 *)in_R8,
                                     (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                     (basic_string_view<char,_std::char_traits<char>_> *)
                                     &external_requires,
                                     (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                     (anon_class_8_1_89897ddb_conflict1 *)&local_628);
                          method_signature::~method_signature((method_signature *)&template_file);
                          iVar35 = (int)type_name._M_str + 1;
                          type_name._M_str._0_4_ = iVar35;
                        }
                      }
                      else if (*(char *)((long)&p_Var26[2]._M_left + 1) == '\x01') {
                        winmd::reader::TypeDef::MethodList
                                  ((pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> *)
                                   &base_type_argument,(TypeDef *)p_Var1);
                        uVar11 = base_type_argument.field_2._8_4_;
                        type_name._M_str = (char *)base_type_argument._M_string_length;
                        type_name._M_len = (size_t)base_type_argument._M_dataplus._M_p;
                        sVar9 = type_name;
                        sVar31 = CONCAT71(base_type_argument.field_2._M_allocated_capacity._1_7_,
                                          base_type_argument.field_2._M_local_buf[0]);
                        type_name._M_str._0_4_ = (int)base_type_argument._M_string_length;
                        iVar35 = (int)type_name._M_str;
                        type_name = sVar9;
                        while ((type_name._M_len != sVar31 || (iVar35 != uVar11))) {
                          method_signature::method_signature
                                    ((method_signature *)&template_file,(MethodDef *)&type_name);
                          type_namespace = get_name((MethodDef *)&type_name);
                          method_signature::is_async((method_signature *)&template_file);
                          bVar15 = is_add_overload((MethodDef *)&type_name);
                          if ((bVar15) ||
                             (bVar15 = is_remove_overload((MethodDef *)&type_name), bVar15)) {
                            local_5e8._0_8_ = (method_signature *)0x77;
                            local_5e8._8_8_ =
                                 "    % %::%(%)\n    {\n        auto f = make<winrt::@::factory_implementation::%>().as<%>();\n        return f.%(%);\n    }\n"
                            ;
                            ppVar24 = (path *)&__a2_1;
                            in_R8 = (string *)&type_namespace;
                            local_628._M_len = (size_t)&template_file;
                            local_5d8._0_8_ = (method_signature *)&template_file;
                            writer_base<cppwinrt::writer>::
                            write_segment<winmd::reader::RetTypeSig,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                                      ((writer_base<cppwinrt::writer> *)&output_folder,
                                       (string_view *)local_5e8,(RetTypeSig *)local_3e8,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                                       (anon_class_8_1_89897ddb_conflict1 *)&local_628,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &external_requires,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(p_Var26 + 1),
                                       (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                                       (anon_class_8_1_89897ddb_conflict1 *)local_5d8);
                          }
                          else {
                            bVar15 = is_put_overload((MethodDef *)&type_name);
                            local_5d8._0_8_ = "";
                            if ((local_340 & 1U) != 0) {
                              local_5d8._0_8_ = "return ";
                            }
                            if (bVar15) {
                              local_5d8._0_8_ = "";
                            }
                            local_5e8._0_8_ = (method_signature *)0x3f;
                            local_5e8._8_8_ =
                                 "    % %::%(%)\n    {\n        %@::implementation::%::%(%);\n    }\n"
                            ;
                            ppVar24 = (path *)&__a2_1;
                            in_R8 = (string *)&type_namespace;
                            local_628._M_len = (size_t)&template_file;
                            local_440.args = (method_signature *)&template_file;
                            writer_base<cppwinrt::writer>::
                            write_segment<winmd::reader::RetTypeSig,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                                      ((writer_base<cppwinrt::writer> *)&output_folder,
                                       (string_view *)local_5e8,(RetTypeSig *)local_3e8,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                                       (anon_class_8_1_89897ddb_conflict1 *)&local_628,
                                       (char **)local_5d8,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &external_requires,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                                       &local_440);
                          }
                          bVar15 = is_add_overload((MethodDef *)&type_name);
                          if (bVar15) {
                            local_5e8._0_8_ = (method_signature *)0xa4;
                            local_5e8._8_8_ =
                                 "    %::%_revoker %::%(auto_revoke_t, %)\n    {\n        auto f = make<winrt::@::factory_implementation::%>().as<%>();\n        return %::%_revoker{ f, f.%(%) };\n    }\n"
                            ;
                            in_R8 = (string *)&__a2_1;
                            ppVar24 = (path *)&type_namespace;
                            local_628._M_len = (size_t)&template_file;
                            local_5d8._0_8_ = (method_signature *)&template_file;
                            writer_base<cppwinrt::writer>::
                            write_segment<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                                      ((writer_base<cppwinrt::writer> *)&output_folder,
                                       (string_view *)local_5e8,
                                       (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (anon_class_8_1_89897ddb_conflict1 *)&local_628,
                                       (basic_string_view<char,_std::char_traits<char>_> *)
                                       &external_requires,
                                       (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(p_Var26 + 1),
                                       (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                                       (anon_class_8_1_89897ddb_conflict1 *)local_5d8);
                          }
                          method_signature::~method_signature((method_signature *)&template_file);
                          iVar35 = (int)type_name._M_str + 1;
                          type_name._M_str._0_4_ = iVar35;
                        }
                      }
                    }
                    else {
                      ppVar48 = (path *)0x10b568;
                      bVar15 = is_always_disabled((TypeDef *)p_Var1);
                      if (!bVar15) goto LAB_0010b570;
                    }
                    ppVar48 = (path *)0x10ba47;
                  }
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::factory_info>_>_>
                               *)&license_arg);
                  finish_with::~finish_with((finish_with *)&base_interfaces);
                }
                std::__cxx11::string::~string((string *)&fast_abi_size);
                get_generated_component_filename_abi_cxx11_
                          ((string *)&fast_abi_size,(cppwinrt *)pmVar32,type_01);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &template_file,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (settings + 0x60),(string *)&fast_abi_size);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &license_arg,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &template_file,".g.cpp");
                std::__cxx11::string::~string((string *)&template_file);
                std::__cxx11::string::~string((string *)&fast_abi_size);
                std::filesystem::__cxx11::path::
                path<std::__cxx11::string,std::filesystem::__cxx11::path>
                          ((path *)&template_file,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &license_arg,auto_format);
                std::filesystem::__cxx11::path::remove_filename();
                std::filesystem::create_directories((path *)&template_file);
                filename = (method_signature *)&license_arg;
                writer_base<cppwinrt::writer>::flush_to_file
                          ((writer_base<cppwinrt::writer> *)&output_folder,&license_arg);
                std::filesystem::__cxx11::path::~path((path *)&template_file);
                std::__cxx11::string::~string((string *)&license_arg);
                writer::~writer((writer *)&output_folder,(UI *)filename,uis_06);
                pUVar37 = extraout_RDX_05;
              }
              if (settings._184_8_ != 0) {
                get_component_filename_abi_cxx11_
                          (&output_folder._M_pathname,(cppwinrt *)pmVar32,(TypeDef *)pUVar37);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &template_file,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (settings + 0xb0),&output_folder._M_pathname);
                filename = (method_signature *)&template_file;
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &__a2_1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&template_file,".h");
                std::__cxx11::string::~string((string *)&template_file);
                std::__cxx11::string::~string((string *)&output_folder);
                pUVar37 = extraout_RDX_06;
                if (settings[0x111] == '\0') {
                  filename = (method_signature *)&__a2_1;
                  std::filesystem::__cxx11::path::
                  path<std::__cxx11::string,std::filesystem::__cxx11::path>
                            ((path *)&template_file,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             filename,auto_format);
                  bVar15 = std::filesystem::exists((path *)&template_file);
                  std::filesystem::__cxx11::path::~path((path *)&template_file);
                  pUVar37 = extraout_RDX_07;
                  if (!bVar15) goto LAB_0010bb8c;
                }
                else {
LAB_0010bb8c:
                  writer::writer((writer *)&template_file,(UI *)filename,pUVar37);
                  write_include_guard((writer *)&template_file);
                  external_requires._0_16_ = winmd::reader::TypeDef::TypeName((TypeDef *)pmVar32);
                  base_interfaces.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                  ._M_impl.super__Vector_impl_data._0_16_ =
                       winmd::reader::TypeDef::TypeNamespace((TypeDef *)pmVar32);
                  TVar43 = get_base_class((TypeDef *)pmVar32);
                  pTVar36 = TVar43.super_row_base<winmd::reader::TypeDef>._8_8_;
                  output_folder._M_pathname._M_dataplus._M_p =
                       (pointer)&output_folder._M_pathname.field_2;
                  output_folder._M_pathname._M_string_length = 0;
                  type_name._0_12_ = TVar43.super_row_base<winmd::reader::TypeDef>._0_12_;
                  output_folder._M_pathname.field_2._M_allocated_capacity =
                       output_folder._M_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  if ((TVar43.super_row_base<winmd::reader::TypeDef>.m_table != (table_base *)0x0)
                     && (bVar15 = winmd::reader::filter::includes
                                            ((filter *)(settings + 0x1b8),(TypeDef *)&type_name),
                        pTVar36 = type_02, bVar15)) {
                    get_component_filename_abi_cxx11_
                              (&base_type_argument,(cppwinrt *)&type_name,type_02);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&fast_abi_size,"#include \"",&base_type_argument);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&license_arg,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&fast_abi_size,".h\"\n");
                    std::__cxx11::string::operator=((string *)&output_folder,(string *)&license_arg)
                    ;
                    std::__cxx11::string::~string((string *)&license_arg);
                    std::__cxx11::string::~string((string *)&fast_abi_size);
                    std::__cxx11::string::~string((string *)&base_type_argument);
                    pTVar36 = extraout_RDX_08;
                  }
                  _Stack_670._M_pi =
                       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       "#include \"%.g.h\"\n%%\nnamespace winrt::@::implementation\n{\n    struct %%\n    {\n        %() = default;\n\n%    };\n}\n"
                  ;
                  fast_abi_size = 0x6f;
                  rest_6 = (anon_class_8_1_89897ddb *)0x10bca1;
                  get_generated_component_filename_abi_cxx11_
                            (&license_arg,(cppwinrt *)pmVar32,pTVar36);
                  type_namespace._M_len = (size_t)pmVar32;
                  in_R8 = (string *)&base_interfaces;
                  ppVar24 = &output_folder;
                  base_type_argument._M_dataplus._M_p = (pointer)pmVar32;
                  writer_base<cppwinrt::writer>::
                  write_segment<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                            ((writer_base<cppwinrt::writer> *)&template_file,
                             (string_view *)&fast_abi_size,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &license_arg,&output_folder._M_pathname,
                             (anon_class_1_0_00000001 *)in_R8,
                             (basic_string_view<char,_std::char_traits<char>_> *)&external_requires,
                             (basic_string_view<char,_std::char_traits<char>_> *)&base_type_argument
                             ,(anon_class_8_1_89897ddb *)&external_requires,&type_namespace,rest_6);
                  std::__cxx11::string::~string((string *)&license_arg);
                  ppVar48 = (path *)0x10bd03;
                  bVar15 = has_factory_members((writer *)&template_file,(TypeDef *)pmVar32);
                  if (bVar15) {
                    license_arg._M_dataplus._M_p = (pointer)0x64;
                    license_arg._M_string_length = (size_type)anon_var_dwarf_a2d4d;
                    in_R8 = &external_requires;
                    ppVar24 = ppVar48;
                    writer_base<cppwinrt::writer>::
                    write_segment<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                              ((writer_base<cppwinrt::writer> *)&template_file,
                               (string_view *)&license_arg,
                               (basic_string_view<char,_std::char_traits<char>_> *)&base_interfaces,
                               (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                               (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                               (basic_string_view<char,_std::char_traits<char>_> *)in_R8,
                               (basic_string_view<char,_std::char_traits<char>_> *)in_R8);
                  }
                  std::__cxx11::string::~string((string *)&output_folder);
                  filename = (method_signature *)&__a2_1;
                  writer_base<cppwinrt::writer>::flush_to_file
                            ((writer_base<cppwinrt::writer> *)&template_file,(string *)filename);
                  writer::~writer((writer *)&template_file,(UI *)filename,uis_07);
                }
                std::__cxx11::string::~string((string *)&__a2_1);
                pUVar37 = type_03;
                if (settings._184_8_ != 0) {
                  get_component_filename_abi_cxx11_
                            (&output_folder._M_pathname,(cppwinrt *)pmVar32,(TypeDef *)type_03);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&template_file,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(settings + 0xb0),&output_folder._M_pathname);
                  filename = (method_signature *)&template_file;
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&license_arg,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&template_file,".cpp");
                  std::__cxx11::string::~string((string *)&template_file);
                  std::__cxx11::string::~string((string *)&output_folder);
                  pUVar37 = extraout_RDX_09;
                  if (settings[0x111] == '\0') {
                    filename = (method_signature *)&license_arg;
                    std::filesystem::__cxx11::path::
                    path<std::__cxx11::string,std::filesystem::__cxx11::path>
                              ((path *)&template_file,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &license_arg,auto_format);
                    bVar15 = std::filesystem::exists((path *)&template_file);
                    std::filesystem::__cxx11::path::~path((path *)&template_file);
                    pUVar37 = extraout_RDX_10;
                    if (!bVar15) goto LAB_0010bdf2;
                  }
                  else {
LAB_0010bdf2:
                    writer::writer((writer *)&template_file,(UI *)filename,pUVar37);
                    write_pch((writer *)&template_file);
                    get_component_filename_abi_cxx11_
                              (&output_folder._M_pathname,(cppwinrt *)pmVar32,type_04);
                    fast_abi_size = 0xf;
                    _Stack_670._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x197f69;
                    writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                              ((writer_base<cppwinrt::writer> *)&template_file,
                               (string_view *)&fast_abi_size,&output_folder._M_pathname);
                    std::__cxx11::string::~string((string *)&output_folder);
                    if (settings[0x138] == '\x01') {
                      get_generated_component_filename_abi_cxx11_
                                (&output_folder._M_pathname,(cppwinrt *)pmVar32,type_05);
                      fast_abi_size = 0x13;
                      _Stack_670._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1a2ff7;
                      writer_base<cppwinrt::writer>::write_segment<std::__cxx11::string>
                                ((writer_base<cppwinrt::writer> *)&template_file,
                                 (string_view *)&fast_abi_size,&output_folder._M_pathname);
                      std::__cxx11::string::~string((string *)&output_folder);
                    }
                    output_folder._M_pathname._M_dataplus._M_p = (pointer)0x2a;
                    output_folder._M_pathname._M_string_length = (size_type)anon_var_dwarf_a2e23;
                    _fast_abi_size = winmd::reader::TypeDef::TypeNamespace((TypeDef *)pmVar32);
                    ppVar24 = (path *)&base_type_argument;
                    base_type_argument._M_dataplus._M_p = (pointer)pmVar32;
                    writer_base<cppwinrt::writer>::
                    write_segment<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
                              ((writer_base<cppwinrt::writer> *)&template_file,
                               (string_view *)&output_folder,
                               (anon_class_1_0_00000001 *)&fast_abi_size,
                               (basic_string_view<char,_std::char_traits<char>_> *)ppVar24,
                               (anon_class_8_1_89897ddb *)in_R8);
                    filename = (method_signature *)&license_arg;
                    writer_base<cppwinrt::writer>::flush_to_file
                              ((writer_base<cppwinrt::writer> *)&template_file,&license_arg);
                    writer::~writer((writer *)&template_file,(UI *)filename,uis_08);
                  }
                  std::__cxx11::string::~string((string *)&license_arg);
                  pUVar37 = extraout_RDX_11;
                }
              }
              pmVar32 = (method_signature *)&pmVar32->m_signature;
            }
          }
          std::_Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::
          ~_Vector_base(&classes.
                         super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                       );
        }
        task_group::get(&group);
        pUVar37 = extraout_RDX_12;
        if (settings[0xa9] == '\x01') {
          filename = (method_signature *)&template_file;
          _template_file = (pointer)0xc;
          cStack_400._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x167a00;
          lVar33 = std::chrono::_V2::system_clock::now();
          output_folder._M_pathname._M_dataplus._M_p = (pointer)((lVar33 - lVar21) / 1000000);
          writer_base<cppwinrt::writer>::write_segment<long>
                    (&w.super_writer_base<cppwinrt::writer>,(string_view *)filename,
                     (long *)&output_folder);
          pUVar37 = extraout_RDX_13;
        }
        writer::~writer(&ixx,(UI *)filename,pUVar37);
        task_group::~task_group(&group);
        winmd::reader::cache::~cache(&c);
        std::
        _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)&args);
        ui = (UI *)0x1;
        writer_base<cppwinrt::writer>::flush_to_console(&w.super_writer_base<cppwinrt::writer>,true)
        ;
        writer::~writer(&w,ui,uis_09);
        return 0;
      }
    }
  }
  uVar34 = __cxa_allocate_exception(1);
  __cxa_throw(uVar34,&usage_exception::typeinfo,0);
}

Assistant:

static int run(int const argc, char** argv)
    {
        int result{};
        writer w;

        try
        {
            auto start = get_start_time();

            reader args{ argc, argv, options };

            if (!args || args.exists("help") || args.exists("?"))
            {
                throw usage_exception{};
            }

            process_args(args);
            cache c{ get_files_to_cache(), [](TypeDef const& type) { return type.Flags().WindowsRuntime(); } };
            remove_foundation_types(c);
            build_filters(c);
            settings.base = settings.base || (!settings.component && settings.projection_filter.empty());
            build_fastabi_cache(c);

            if (settings.verbose)
            {
                {
                    char* path = argv[0];
#if defined(_WIN32) || defined(_WIN64)
                    char path_buf[32768];
                    DWORD path_size = GetModuleFileNameA(nullptr, path_buf, sizeof(path_buf));
                    if (path_size)
                    {
                        path_buf[sizeof(path_buf) - 1] = 0;
                        path = path_buf;
                    }
#endif
                    w.write(" tool:  %\n", path);
                }
                w.write(" ver:   %\n", CPPWINRT_VERSION_STRING);

                for (auto&& file : settings.input)
                {
                    w.write(" in:    %\n", file);
                }

                for (auto&& file : settings.reference)
                {
                    w.write(" ref:   %\n", file);
                }

                w.write(" out:   %\n", settings.output_folder);

                if (!settings.component_folder.empty())
                {
                    w.write(" cout:  %\n", settings.component_folder);
                }
            }

            w.flush_to_console();
            task_group group;
            group.synchronous(args.exists("synchronous"));
            writer ixx;
            write_preamble(ixx);
            ixx.write("module;\n");
            ixx.write(strings::base_includes);
            ixx.write("\nexport module winrt;\n#define WINRT_EXPORT export\n\n");

            for (auto&&[ns, members] : c.namespaces())
            {
                if (!has_projected_types(members) || !settings.projection_filter.includes(members))
                {
                    continue;
                }

                ixx.write("#include \"winrt/%.h\"\n", ns);

                group.add([&, &ns = ns, &members = members]
                {
                    write_namespace_0_h(ns, members);
                    write_namespace_1_h(ns, members);
                    write_namespace_2_h(ns, members);
                    write_namespace_h(c, ns, members);
                });
            }

            if (settings.base)
            {
                write_base_h();
                ixx.flush_to_file(settings.output_folder + "winrt/winrt.ixx");
            }

            if (settings.component)
            {
                std::vector<TypeDef> classes;

                for (auto&&[ns, members] : c.namespaces())
                {
                    for (auto&& type : members.classes)
                    {
                        if (settings.component_filter.includes(type))
                        {
                            classes.push_back(type);
                        }
                    }
                }

                if (!classes.empty())
                {
                    write_fast_forward_h(classes);
                    write_module_g_cpp(classes);

                    for (auto&& type : classes)
                    {
                        write_component_g_h(type);
                        write_component_g_cpp(type);
                        write_component_h(type);
                        write_component_cpp(type);
                    }
                }
            }

            group.get();

            if (settings.verbose)
            {
                w.write(" time:  %ms\n", get_elapsed_time(start));
            }
        }
        catch (usage_exception const&)
        {
            print_usage(w);
        }
        catch (std::exception const& e)
        {
            w.write("cppwinrt : error %\n", e.what());
            result = 1;
        }

        w.flush_to_console(result == 0);
        return result;
    }